

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [28];
  undefined1 auVar93 [32];
  undefined1 auVar94 [24];
  byte bVar95;
  uint uVar96;
  int iVar97;
  ulong uVar98;
  uint uVar99;
  ulong uVar100;
  long lVar101;
  bool bVar102;
  ulong uVar103;
  Geometry *geometry;
  long lVar104;
  undefined4 uVar105;
  undefined8 uVar106;
  undefined1 auVar107 [16];
  float fVar123;
  undefined1 auVar111 [32];
  undefined1 auVar108 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar109 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar110 [16];
  undefined1 auVar122 [32];
  undefined8 uVar124;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar134;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar135;
  float fVar152;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar183;
  float fVar192;
  float fVar193;
  undefined1 auVar184 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar194;
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  float fVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 in_ZMM10 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  float fVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_960 [32];
  undefined8 local_940;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined1 local_920 [32];
  undefined1 local_8a0 [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  LinearSpace3fa *local_670;
  Primitive *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  int local_3a0;
  int local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar148 [32];
  
  PVar14 = prim[1];
  uVar98 = (ulong)(byte)PVar14;
  lVar23 = uVar98 * 0x25;
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar198 = *(float *)(prim + lVar23 + 0x12);
  auVar20 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + lVar23 + 6));
  auVar107._0_4_ = fVar198 * auVar20._0_4_;
  auVar107._4_4_ = fVar198 * auVar20._4_4_;
  auVar107._8_4_ = fVar198 * auVar20._8_4_;
  auVar107._12_4_ = fVar198 * auVar20._12_4_;
  auVar136._0_4_ = fVar198 * auVar21._0_4_;
  auVar136._4_4_ = fVar198 * auVar21._4_4_;
  auVar136._8_4_ = fVar198 * auVar21._8_4_;
  auVar136._12_4_ = fVar198 * auVar21._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar98 * 4 + 6);
  auVar125 = vpmovsxbd_avx2(auVar20);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar98 * 5 + 6);
  auVar122 = vpmovsxbd_avx2(auVar21);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar98 * 6 + 6);
  auVar118 = vpmovsxbd_avx2(auVar7);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar98 * 0xf + 6);
  auVar131 = vpmovsxbd_avx2(auVar8);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar121 = vpmovsxbd_avx2(auVar9);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar98 + 6);
  auVar22 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar98 * 0x1a + 6);
  auVar181 = vpmovsxbd_avx2(auVar11);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar98 * 0x1b + 6);
  auVar186 = vpmovsxbd_avx2(auVar12);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar98 * 0x1c + 6);
  auVar120 = vpmovsxbd_avx2(auVar13);
  auVar19 = vcvtdq2ps_avx(auVar186);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar217._4_4_ = auVar136._0_4_;
  auVar217._0_4_ = auVar136._0_4_;
  auVar217._8_4_ = auVar136._0_4_;
  auVar217._12_4_ = auVar136._0_4_;
  auVar217._16_4_ = auVar136._0_4_;
  auVar217._20_4_ = auVar136._0_4_;
  auVar217._24_4_ = auVar136._0_4_;
  auVar217._28_4_ = auVar136._0_4_;
  auVar20 = vmovshdup_avx(auVar136);
  uVar106 = auVar20._0_8_;
  auVar221._8_8_ = uVar106;
  auVar221._0_8_ = uVar106;
  auVar221._16_8_ = uVar106;
  auVar221._24_8_ = uVar106;
  auVar20 = vshufps_avx(auVar136,auVar136,0xaa);
  fVar198 = auVar20._0_4_;
  auVar190._0_4_ = fVar198 * auVar118._0_4_;
  fVar205 = auVar20._4_4_;
  auVar190._4_4_ = fVar205 * auVar118._4_4_;
  auVar190._8_4_ = fVar198 * auVar118._8_4_;
  auVar190._12_4_ = fVar205 * auVar118._12_4_;
  auVar190._16_4_ = fVar198 * auVar118._16_4_;
  auVar190._20_4_ = fVar205 * auVar118._20_4_;
  auVar190._28_36_ = in_ZMM10._28_36_;
  auVar190._24_4_ = fVar198 * auVar118._24_4_;
  auVar187._4_4_ = auVar22._4_4_ * fVar205;
  auVar187._0_4_ = auVar22._0_4_ * fVar198;
  auVar187._8_4_ = auVar22._8_4_ * fVar198;
  auVar187._12_4_ = auVar22._12_4_ * fVar205;
  auVar187._16_4_ = auVar22._16_4_ * fVar198;
  auVar187._20_4_ = auVar22._20_4_ * fVar205;
  auVar187._24_4_ = auVar22._24_4_ * fVar198;
  auVar187._28_4_ = auVar186._28_4_;
  auVar178._0_4_ = auVar120._0_4_ * fVar198;
  auVar178._4_4_ = auVar120._4_4_ * fVar205;
  auVar178._8_4_ = auVar120._8_4_ * fVar198;
  auVar178._12_4_ = auVar120._12_4_ * fVar205;
  auVar178._16_4_ = auVar120._16_4_ * fVar198;
  auVar178._20_4_ = auVar120._20_4_ * fVar205;
  auVar178._24_4_ = auVar120._24_4_ * fVar198;
  auVar178._28_4_ = 0;
  auVar20 = vfmadd231ps_fma(auVar190._0_32_,auVar221,auVar122);
  auVar21 = vfmadd231ps_fma(auVar187,auVar221,auVar121);
  auVar7 = vfmadd231ps_fma(auVar178,auVar19,auVar221);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar217,auVar125);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar217,auVar131);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar181,auVar217);
  auVar218._4_4_ = auVar107._0_4_;
  auVar218._0_4_ = auVar107._0_4_;
  auVar218._8_4_ = auVar107._0_4_;
  auVar218._12_4_ = auVar107._0_4_;
  auVar218._16_4_ = auVar107._0_4_;
  auVar218._20_4_ = auVar107._0_4_;
  auVar218._24_4_ = auVar107._0_4_;
  auVar218._28_4_ = auVar107._0_4_;
  auVar20 = vmovshdup_avx(auVar107);
  uVar106 = auVar20._0_8_;
  auVar222._8_8_ = uVar106;
  auVar222._0_8_ = uVar106;
  auVar222._16_8_ = uVar106;
  auVar222._24_8_ = uVar106;
  auVar20 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar198 = auVar20._0_4_;
  auVar144._0_4_ = fVar198 * auVar118._0_4_;
  fVar205 = auVar20._4_4_;
  auVar144._4_4_ = fVar205 * auVar118._4_4_;
  auVar144._8_4_ = fVar198 * auVar118._8_4_;
  auVar144._12_4_ = fVar205 * auVar118._12_4_;
  auVar144._16_4_ = fVar198 * auVar118._16_4_;
  auVar144._20_4_ = fVar205 * auVar118._20_4_;
  auVar144._24_4_ = fVar198 * auVar118._24_4_;
  auVar144._28_4_ = 0;
  auVar186._4_4_ = auVar22._4_4_ * fVar205;
  auVar186._0_4_ = auVar22._0_4_ * fVar198;
  auVar186._8_4_ = auVar22._8_4_ * fVar198;
  auVar186._12_4_ = auVar22._12_4_ * fVar205;
  auVar186._16_4_ = auVar22._16_4_ * fVar198;
  auVar186._20_4_ = auVar22._20_4_ * fVar205;
  auVar186._24_4_ = auVar22._24_4_ * fVar198;
  auVar186._28_4_ = auVar118._28_4_;
  auVar118._4_4_ = auVar120._4_4_ * fVar205;
  auVar118._0_4_ = auVar120._0_4_ * fVar198;
  auVar118._8_4_ = auVar120._8_4_ * fVar198;
  auVar118._12_4_ = auVar120._12_4_ * fVar205;
  auVar118._16_4_ = auVar120._16_4_ * fVar198;
  auVar118._20_4_ = auVar120._20_4_ * fVar205;
  auVar118._24_4_ = auVar120._24_4_ * fVar198;
  auVar118._28_4_ = fVar205;
  auVar20 = vfmadd231ps_fma(auVar144,auVar222,auVar122);
  auVar9 = vfmadd231ps_fma(auVar186,auVar222,auVar121);
  auVar10 = vfmadd231ps_fma(auVar118,auVar222,auVar19);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar218,auVar125);
  local_420._8_4_ = 0x7fffffff;
  local_420._0_8_ = 0x7fffffff7fffffff;
  local_420._12_4_ = 0x7fffffff;
  local_420._16_4_ = 0x7fffffff;
  local_420._20_4_ = 0x7fffffff;
  local_420._24_4_ = 0x7fffffff;
  local_420._28_4_ = 0x7fffffff;
  auVar155._8_4_ = 0x219392ef;
  auVar155._0_8_ = 0x219392ef219392ef;
  auVar155._12_4_ = 0x219392ef;
  auVar155._16_4_ = 0x219392ef;
  auVar155._20_4_ = 0x219392ef;
  auVar155._24_4_ = 0x219392ef;
  auVar155._28_4_ = 0x219392ef;
  auVar125 = vandps_avx(ZEXT1632(auVar8),local_420);
  auVar125 = vcmpps_avx(auVar125,auVar155,1);
  auVar122 = vblendvps_avx(ZEXT1632(auVar8),auVar155,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar21),local_420);
  auVar125 = vcmpps_avx(auVar125,auVar155,1);
  auVar118 = vblendvps_avx(ZEXT1632(auVar21),auVar155,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar7),local_420);
  auVar125 = vcmpps_avx(auVar125,auVar155,1);
  auVar125 = vblendvps_avx(ZEXT1632(auVar7),auVar155,auVar125);
  auVar136 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar218,auVar131);
  auVar131 = vrcpps_avx(auVar122);
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar218,auVar181);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar179._16_4_ = 0x3f800000;
  auVar179._20_4_ = 0x3f800000;
  auVar179._24_4_ = 0x3f800000;
  auVar179._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar122,auVar131,auVar179);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar131,auVar131);
  auVar122 = vrcpps_avx(auVar118);
  auVar21 = vfnmadd213ps_fma(auVar118,auVar122,auVar179);
  auVar118 = vrcpps_avx(auVar125);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar122,auVar122);
  auVar7 = vfnmadd213ps_fma(auVar125,auVar118,auVar179);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar118,auVar118);
  fVar198 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 7 + 6));
  auVar165._4_4_ = fVar198;
  auVar165._0_4_ = fVar198;
  auVar165._8_4_ = fVar198;
  auVar165._12_4_ = fVar198;
  auVar165._16_4_ = fVar198;
  auVar165._20_4_ = fVar198;
  auVar165._24_4_ = fVar198;
  auVar165._28_4_ = fVar198;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0xb + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,auVar125);
  auVar8 = vfmadd213ps_fma(auVar122,auVar165,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 9 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0xd + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,auVar125);
  auVar9 = vfmadd213ps_fma(auVar122,auVar165,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x12 + 6));
  uVar100 = (ulong)(uint)((int)(uVar98 * 5) << 2);
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 2 + uVar100 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,auVar125);
  auVar10 = vfmadd213ps_fma(auVar122,auVar165,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 + 6));
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x18 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,auVar125);
  auVar11 = vfmadd213ps_fma(auVar122,auVar165,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x1d + 6));
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 + (ulong)(byte)PVar14 * 0x20 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,auVar125);
  auVar12 = vfmadd213ps_fma(auVar122,auVar165,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar14 * 0x20 - uVar98) + 6)
                           );
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x23 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,auVar125);
  auVar13 = vfmadd213ps_fma(auVar122,auVar165,auVar125);
  auVar125 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar107));
  auVar131._4_4_ = auVar20._4_4_ * auVar125._4_4_;
  auVar131._0_4_ = auVar20._0_4_ * auVar125._0_4_;
  auVar131._8_4_ = auVar20._8_4_ * auVar125._8_4_;
  auVar131._12_4_ = auVar20._12_4_ * auVar125._12_4_;
  auVar131._16_4_ = auVar125._16_4_ * 0.0;
  auVar131._20_4_ = auVar125._20_4_ * 0.0;
  auVar131._24_4_ = auVar125._24_4_ * 0.0;
  auVar131._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar107));
  auVar121._4_4_ = auVar20._4_4_ * auVar125._4_4_;
  auVar121._0_4_ = auVar20._0_4_ * auVar125._0_4_;
  auVar121._8_4_ = auVar20._8_4_ * auVar125._8_4_;
  auVar121._12_4_ = auVar20._12_4_ * auVar125._12_4_;
  auVar121._16_4_ = auVar125._16_4_ * 0.0;
  auVar121._20_4_ = auVar125._20_4_ * 0.0;
  auVar121._24_4_ = auVar125._24_4_ * 0.0;
  auVar121._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar136));
  auVar22._4_4_ = auVar21._4_4_ * auVar125._4_4_;
  auVar22._0_4_ = auVar21._0_4_ * auVar125._0_4_;
  auVar22._8_4_ = auVar21._8_4_ * auVar125._8_4_;
  auVar22._12_4_ = auVar21._12_4_ * auVar125._12_4_;
  auVar22._16_4_ = auVar125._16_4_ * 0.0;
  auVar22._20_4_ = auVar125._20_4_ * 0.0;
  auVar22._24_4_ = auVar125._24_4_ * 0.0;
  auVar22._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar136));
  auVar181._4_4_ = auVar21._4_4_ * auVar125._4_4_;
  auVar181._0_4_ = auVar21._0_4_ * auVar125._0_4_;
  auVar181._8_4_ = auVar21._8_4_ * auVar125._8_4_;
  auVar181._12_4_ = auVar21._12_4_ * auVar125._12_4_;
  auVar181._16_4_ = auVar125._16_4_ * 0.0;
  auVar181._20_4_ = auVar125._20_4_ * 0.0;
  auVar181._24_4_ = auVar125._24_4_ * 0.0;
  auVar181._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar108));
  auVar19._4_4_ = auVar7._4_4_ * auVar125._4_4_;
  auVar19._0_4_ = auVar7._0_4_ * auVar125._0_4_;
  auVar19._8_4_ = auVar7._8_4_ * auVar125._8_4_;
  auVar19._12_4_ = auVar7._12_4_ * auVar125._12_4_;
  auVar19._16_4_ = auVar125._16_4_ * 0.0;
  auVar19._20_4_ = auVar125._20_4_ * 0.0;
  auVar19._24_4_ = auVar125._24_4_ * 0.0;
  auVar19._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar108));
  auVar120._4_4_ = auVar7._4_4_ * auVar125._4_4_;
  auVar120._0_4_ = auVar7._0_4_ * auVar125._0_4_;
  auVar120._8_4_ = auVar7._8_4_ * auVar125._8_4_;
  auVar120._12_4_ = auVar7._12_4_ * auVar125._12_4_;
  auVar120._16_4_ = auVar125._16_4_ * 0.0;
  auVar120._20_4_ = auVar125._20_4_ * 0.0;
  auVar120._24_4_ = auVar125._24_4_ * 0.0;
  auVar120._28_4_ = auVar125._28_4_;
  auVar125 = vpminsd_avx2(auVar131,auVar121);
  auVar122 = vpminsd_avx2(auVar22,auVar181);
  auVar125 = vmaxps_avx(auVar125,auVar122);
  auVar122 = vpminsd_avx2(auVar19,auVar120);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar180._4_4_ = uVar105;
  auVar180._0_4_ = uVar105;
  auVar180._8_4_ = uVar105;
  auVar180._12_4_ = uVar105;
  auVar180._16_4_ = uVar105;
  auVar180._20_4_ = uVar105;
  auVar180._24_4_ = uVar105;
  auVar180._28_4_ = uVar105;
  auVar122 = vmaxps_avx(auVar122,auVar180);
  auVar125 = vmaxps_avx(auVar125,auVar122);
  local_80._4_4_ = auVar125._4_4_ * 0.99999964;
  local_80._0_4_ = auVar125._0_4_ * 0.99999964;
  local_80._8_4_ = auVar125._8_4_ * 0.99999964;
  local_80._12_4_ = auVar125._12_4_ * 0.99999964;
  local_80._16_4_ = auVar125._16_4_ * 0.99999964;
  local_80._20_4_ = auVar125._20_4_ * 0.99999964;
  local_80._24_4_ = auVar125._24_4_ * 0.99999964;
  local_80._28_4_ = auVar125._28_4_;
  auVar125 = vpmaxsd_avx2(auVar131,auVar121);
  auVar122 = vpmaxsd_avx2(auVar22,auVar181);
  auVar125 = vminps_avx(auVar125,auVar122);
  auVar122 = vpmaxsd_avx2(auVar19,auVar120);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar145._4_4_ = uVar105;
  auVar145._0_4_ = uVar105;
  auVar145._8_4_ = uVar105;
  auVar145._12_4_ = uVar105;
  auVar145._16_4_ = uVar105;
  auVar145._20_4_ = uVar105;
  auVar145._24_4_ = uVar105;
  auVar145._28_4_ = uVar105;
  auVar122 = vminps_avx(auVar122,auVar145);
  auVar125 = vminps_avx(auVar125,auVar122);
  auVar202._4_4_ = auVar125._4_4_ * 1.0000004;
  auVar202._0_4_ = auVar125._0_4_ * 1.0000004;
  auVar202._8_4_ = auVar125._8_4_ * 1.0000004;
  auVar202._12_4_ = auVar125._12_4_ * 1.0000004;
  auVar202._16_4_ = auVar125._16_4_ * 1.0000004;
  auVar202._20_4_ = auVar125._20_4_ * 1.0000004;
  auVar202._24_4_ = auVar125._24_4_ * 1.0000004;
  auVar202._28_4_ = auVar125._28_4_;
  auVar125._1_3_ = 0;
  auVar125[0] = PVar14;
  auVar125[4] = PVar14;
  auVar125._5_3_ = 0;
  auVar125[8] = PVar14;
  auVar125._9_3_ = 0;
  auVar125[0xc] = PVar14;
  auVar125._13_3_ = 0;
  auVar125[0x10] = PVar14;
  auVar125._17_3_ = 0;
  auVar125[0x14] = PVar14;
  auVar125._21_3_ = 0;
  auVar125[0x18] = PVar14;
  auVar125._25_3_ = 0;
  auVar125[0x1c] = PVar14;
  auVar125._29_3_ = 0;
  auVar122 = vpcmpgtd_avx2(auVar125,_DAT_01fe9900);
  auVar125 = vcmpps_avx(local_80,auVar202,2);
  auVar125 = vandps_avx(auVar125,auVar122);
  uVar96 = vmovmskps_avx(auVar125);
  if (uVar96 == 0) {
    bVar102 = false;
  }
  else {
    uVar96 = uVar96 & 0xff;
    local_660 = mm_lookupmask_ps._16_8_;
    uStack_658 = mm_lookupmask_ps._24_8_;
    uStack_650 = mm_lookupmask_ps._16_8_;
    uStack_648 = mm_lookupmask_ps._24_8_;
    local_670 = pre->ray_space + k;
    iVar97 = 1 << ((uint)k & 0x1f);
    auVar111._4_4_ = iVar97;
    auVar111._0_4_ = iVar97;
    auVar111._8_4_ = iVar97;
    auVar111._12_4_ = iVar97;
    auVar111._16_4_ = iVar97;
    auVar111._20_4_ = iVar97;
    auVar111._24_4_ = iVar97;
    auVar111._28_4_ = iVar97;
    auVar122 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar125 = vpand_avx2(auVar111,auVar122);
    local_440 = vpcmpeqd_avx2(auVar125,auVar122);
    local_450 = 0x7fffffff;
    uStack_44c = 0x7fffffff;
    uStack_448 = 0x7fffffff;
    uStack_444 = 0x7fffffff;
    local_668 = prim;
    do {
      lVar23 = 0;
      for (uVar98 = (ulong)uVar96; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      local_8a0._4_4_ = *(undefined4 *)(local_668 + 2);
      uStack_818._0_4_ = *(uint *)(local_668 + lVar23 * 4 + 6);
      pGVar15 = (context->scene->geometries).items[(uint)local_8a0._4_4_].ptr;
      local_600._0_8_ = CONCAT44(0,(uint)uStack_818);
      uVar98 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                               CONCAT44(0,(uint)uStack_818) *
                               pGVar15[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar198 = (pGVar15->time_range).lower;
      fVar198 = pGVar15->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar198) /
                ((pGVar15->time_range).upper - fVar198));
      auVar20 = vroundss_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),9);
      auVar20 = vminss_avx(auVar20,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
      auVar20 = vmaxss_avx(ZEXT816(0) << 0x20,auVar20);
      fVar198 = fVar198 - auVar20._0_4_;
      _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar101 = (long)(int)auVar20._0_4_ * 0x38;
      lVar23 = *(long *)(_Var16 + 0x10 + lVar101);
      lVar104 = *(long *)(_Var16 + 0x38 + lVar101);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar101);
      pfVar1 = (float *)(lVar104 + uVar98 * lVar17);
      auVar159._0_4_ = fVar198 * *pfVar1;
      auVar159._4_4_ = fVar198 * pfVar1[1];
      auVar159._8_4_ = fVar198 * pfVar1[2];
      auVar159._12_4_ = fVar198 * pfVar1[3];
      pfVar1 = (float *)(lVar104 + (uVar98 + 1) * lVar17);
      auVar199._0_4_ = fVar198 * *pfVar1;
      auVar199._4_4_ = fVar198 * pfVar1[1];
      auVar199._8_4_ = fVar198 * pfVar1[2];
      auVar199._12_4_ = fVar198 * pfVar1[3];
      pfVar1 = (float *)(lVar104 + (uVar98 + 2) * lVar17);
      auVar137._0_4_ = fVar198 * *pfVar1;
      auVar137._4_4_ = fVar198 * pfVar1[1];
      auVar137._8_4_ = fVar198 * pfVar1[2];
      auVar137._12_4_ = fVar198 * pfVar1[3];
      pfVar1 = (float *)(lVar104 + lVar17 * (uVar98 + 3));
      auVar153._0_4_ = fVar198 * *pfVar1;
      auVar153._4_4_ = fVar198 * pfVar1[1];
      auVar153._8_4_ = fVar198 * pfVar1[2];
      auVar153._12_4_ = fVar198 * pfVar1[3];
      lVar104 = *(long *)(_Var16 + lVar101);
      fVar198 = 1.0 - fVar198;
      auVar108._4_4_ = fVar198;
      auVar108._0_4_ = fVar198;
      auVar108._8_4_ = fVar198;
      auVar108._12_4_ = fVar198;
      auVar10 = vfmadd231ps_fma(auVar159,auVar108,*(undefined1 (*) [16])(lVar104 + lVar23 * uVar98))
      ;
      auVar11 = vfmadd231ps_fma(auVar199,auVar108,
                                *(undefined1 (*) [16])(lVar104 + lVar23 * (uVar98 + 1)));
      auVar12 = vfmadd231ps_fma(auVar137,auVar108,
                                *(undefined1 (*) [16])(lVar104 + lVar23 * (uVar98 + 2)));
      _local_680 = vfmadd231ps_fma(auVar153,auVar108,
                                   *(undefined1 (*) [16])(lVar104 + lVar23 * (uVar98 + 3)));
      iVar97 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar23 = (long)iVar97 * 0x44;
      auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar8 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar21 = vsubps_avx(auVar10,auVar8);
      uVar105 = auVar21._0_4_;
      auVar138._4_4_ = uVar105;
      auVar138._0_4_ = uVar105;
      auVar138._8_4_ = uVar105;
      auVar138._12_4_ = uVar105;
      auVar20 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      aVar5 = (local_670->vx).field_0;
      aVar6 = (local_670->vy).field_0;
      fVar198 = (local_670->vz).field_0.m128[0];
      fVar205 = (local_670->vz).field_0.m128[1];
      fVar206 = (local_670->vz).field_0.m128[2];
      fVar207 = (local_670->vz).field_0.m128[3];
      auVar184._0_4_ = fVar198 * auVar21._0_4_;
      auVar184._4_4_ = fVar205 * auVar21._4_4_;
      auVar184._8_4_ = fVar206 * auVar21._8_4_;
      auVar184._12_4_ = fVar207 * auVar21._12_4_;
      auVar20 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar6,auVar20);
      auVar13 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar5,auVar138);
      auVar20 = vblendps_avx(auVar13,auVar10,8);
      auVar7 = vsubps_avx(auVar11,auVar8);
      uVar105 = auVar7._0_4_;
      auVar154._4_4_ = uVar105;
      auVar154._0_4_ = uVar105;
      auVar154._8_4_ = uVar105;
      auVar154._12_4_ = uVar105;
      auVar21 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar200._0_4_ = fVar198 * auVar7._0_4_;
      auVar200._4_4_ = fVar205 * auVar7._4_4_;
      auVar200._8_4_ = fVar206 * auVar7._8_4_;
      auVar200._12_4_ = fVar207 * auVar7._12_4_;
      auVar21 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar21);
      auVar107 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar5,auVar154);
      auVar21 = vblendps_avx(auVar107,auVar11,8);
      auVar9 = vsubps_avx(auVar12,auVar8);
      uVar105 = auVar9._0_4_;
      auVar175._4_4_ = uVar105;
      auVar175._0_4_ = uVar105;
      auVar175._8_4_ = uVar105;
      auVar175._12_4_ = uVar105;
      auVar7 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar211._0_4_ = fVar198 * auVar9._0_4_;
      auVar211._4_4_ = fVar205 * auVar9._4_4_;
      auVar211._8_4_ = fVar206 * auVar9._8_4_;
      auVar211._12_4_ = fVar207 * auVar9._12_4_;
      auVar7 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar6,auVar7);
      auVar136 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar5,auVar175);
      auVar7 = vblendps_avx(auVar136,auVar12,8);
      auVar9 = vsubps_avx(_local_680,auVar8);
      uVar105 = auVar9._0_4_;
      auVar176._4_4_ = uVar105;
      auVar176._0_4_ = uVar105;
      auVar176._8_4_ = uVar105;
      auVar176._12_4_ = uVar105;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar214._0_4_ = fVar198 * auVar9._0_4_;
      auVar214._4_4_ = fVar205 * auVar9._4_4_;
      auVar214._8_4_ = fVar206 * auVar9._8_4_;
      auVar214._12_4_ = fVar207 * auVar9._12_4_;
      auVar8 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar6,auVar8);
      auVar108 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar5,auVar176);
      auVar8 = vblendps_avx(auVar108,_local_680,8);
      auVar24._4_4_ = uStack_44c;
      auVar24._0_4_ = local_450;
      auVar24._8_4_ = uStack_448;
      auVar24._12_4_ = uStack_444;
      auVar20 = vandps_avx(auVar20,auVar24);
      auVar21 = vandps_avx(auVar21,auVar24);
      auVar9 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vandps_avx(auVar7,auVar24);
      auVar21 = vandps_avx(auVar8,auVar24);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar9,auVar20);
      auVar21 = vmovshdup_avx(auVar20);
      auVar21 = vmaxss_avx(auVar21,auVar20);
      auVar20 = vshufpd_avx(auVar20,auVar20,1);
      auVar20 = vmaxss_avx(auVar20,auVar21);
      auVar21 = vmovshdup_avx(auVar13);
      uVar106 = auVar21._0_8_;
      local_5a0._8_8_ = uVar106;
      local_5a0._0_8_ = uVar106;
      local_5a0._16_8_ = uVar106;
      local_5a0._24_8_ = uVar106;
      auVar21 = vmovshdup_avx(auVar107);
      uVar106 = auVar21._0_8_;
      auVar220._8_8_ = uVar106;
      auVar220._0_8_ = uVar106;
      auVar220._16_8_ = uVar106;
      auVar220._24_8_ = uVar106;
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x908);
      uVar105 = auVar136._0_4_;
      local_580._4_4_ = uVar105;
      local_580._0_4_ = uVar105;
      local_580._8_4_ = uVar105;
      local_580._12_4_ = uVar105;
      local_580._16_4_ = uVar105;
      local_580._20_4_ = uVar105;
      local_580._24_4_ = uVar105;
      local_580._28_4_ = uVar105;
      auVar7 = vmovshdup_avx(auVar136);
      uVar106 = auVar7._0_8_;
      auVar185._8_8_ = uVar106;
      auVar185._0_8_ = uVar106;
      auVar185._16_8_ = uVar106;
      auVar185._24_8_ = uVar106;
      fVar198 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      auVar92 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      auVar7 = vmovshdup_avx(auVar108);
      uVar106 = auVar7._0_8_;
      fVar213 = auVar108._0_4_;
      auVar126._0_4_ = fVar213 * fVar198;
      auVar126._4_4_ = fVar213 * *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      auVar126._8_4_ = fVar213 * *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      auVar126._12_4_ = fVar213 * *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      auVar126._16_4_ = fVar213 * *(float *)(catmullrom_basis0 + lVar23 + 0xd9c);
      auVar126._20_4_ = fVar213 * *(float *)(catmullrom_basis0 + lVar23 + 0xda0);
      auVar126._24_4_ = fVar213 * *(float *)(catmullrom_basis0 + lVar23 + 0xda4);
      auVar126._28_4_ = 0;
      auVar8 = vfmadd231ps_fma(auVar126,auVar125,local_580);
      fVar135 = auVar7._0_4_;
      fVar152 = auVar7._4_4_;
      auVar122._4_4_ = fVar152 * *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      auVar122._0_4_ = fVar135 * fVar198;
      auVar122._8_4_ = fVar135 * *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      auVar122._12_4_ = fVar152 * *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      auVar122._16_4_ = fVar135 * *(float *)(catmullrom_basis0 + lVar23 + 0xd9c);
      auVar122._20_4_ = fVar152 * *(float *)(catmullrom_basis0 + lVar23 + 0xda0);
      auVar122._24_4_ = fVar135 * *(float *)(catmullrom_basis0 + lVar23 + 0xda4);
      auVar122._28_4_ = *(undefined4 *)(catmullrom_basis0 + lVar23 + 0xda8);
      auVar7 = vfmadd231ps_fma(auVar122,auVar125,auVar185);
      auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x484);
      uVar105 = auVar107._0_4_;
      auVar168._4_4_ = uVar105;
      auVar168._0_4_ = uVar105;
      auVar168._8_4_ = uVar105;
      auVar168._12_4_ = uVar105;
      auVar168._16_4_ = uVar105;
      auVar168._20_4_ = uVar105;
      auVar168._24_4_ = uVar105;
      auVar168._28_4_ = uVar105;
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar122,auVar168);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar122,auVar220);
      auVar118 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23);
      local_740._0_4_ = auVar13._0_4_;
      local_740._4_4_ = local_740._0_4_;
      local_740._8_4_ = local_740._0_4_;
      local_740._12_4_ = local_740._0_4_;
      local_740._16_4_ = local_740._0_4_;
      local_740._20_4_ = local_740._0_4_;
      local_740._24_4_ = local_740._0_4_;
      local_740._28_4_ = local_740._0_4_;
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar118,local_740);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar118,local_5a0);
      auVar131 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x908);
      fVar205 = *(float *)(catmullrom_basis1 + lVar23 + 0xd8c);
      fVar206 = *(float *)(catmullrom_basis1 + lVar23 + 0xd90);
      fVar207 = *(float *)(catmullrom_basis1 + lVar23 + 0xd94);
      fVar208 = *(float *)(catmullrom_basis1 + lVar23 + 0xd98);
      fVar209 = *(float *)(catmullrom_basis1 + lVar23 + 0xd9c);
      fVar210 = *(float *)(catmullrom_basis1 + lVar23 + 0xda0);
      fVar123 = *(float *)(catmullrom_basis1 + lVar23 + 0xda4);
      auVar25._4_4_ = fVar206 * fVar213;
      auVar25._0_4_ = fVar205 * fVar213;
      auVar25._8_4_ = fVar207 * fVar213;
      auVar25._12_4_ = fVar208 * fVar213;
      auVar25._16_4_ = fVar209 * fVar213;
      auVar25._20_4_ = fVar210 * fVar213;
      auVar25._24_4_ = fVar123 * fVar213;
      auVar25._28_4_ = fVar213;
      auVar9 = vfmadd231ps_fma(auVar25,auVar131,local_580);
      auVar26._4_4_ = fVar206 * fVar152;
      auVar26._0_4_ = fVar205 * fVar135;
      auVar26._8_4_ = fVar207 * fVar135;
      auVar26._12_4_ = fVar208 * fVar152;
      auVar26._16_4_ = fVar209 * fVar135;
      auVar26._20_4_ = fVar210 * fVar152;
      auVar26._24_4_ = fVar123 * fVar135;
      auVar26._28_4_ = fVar152;
      auVar24 = vfmadd231ps_fma(auVar26,auVar131,auVar185);
      local_4e0 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x484);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_4e0,auVar168);
      auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_4e0,auVar220);
      auVar121 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar121,local_740);
      auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar121,local_5a0);
      _local_4a0 = ZEXT1632(auVar9);
      local_480 = ZEXT1632(auVar8);
      auVar19 = vsubps_avx(_local_4a0,local_480);
      local_4c0 = ZEXT1632(auVar24);
      local_5c0 = ZEXT1632(auVar7);
      local_5e0 = vsubps_avx(local_4c0,local_5c0);
      auVar112._0_4_ = auVar7._0_4_ * auVar19._0_4_;
      auVar112._4_4_ = auVar7._4_4_ * auVar19._4_4_;
      auVar112._8_4_ = auVar7._8_4_ * auVar19._8_4_;
      auVar112._12_4_ = auVar7._12_4_ * auVar19._12_4_;
      auVar112._16_4_ = auVar19._16_4_ * 0.0;
      auVar112._20_4_ = auVar19._20_4_ * 0.0;
      auVar112._24_4_ = auVar19._24_4_ * 0.0;
      auVar112._28_4_ = 0;
      fVar183 = local_5e0._0_4_;
      auVar127._0_4_ = fVar183 * auVar8._0_4_;
      fVar192 = local_5e0._4_4_;
      auVar127._4_4_ = fVar192 * auVar8._4_4_;
      fVar193 = local_5e0._8_4_;
      auVar127._8_4_ = fVar193 * auVar8._8_4_;
      fVar194 = local_5e0._12_4_;
      auVar127._12_4_ = fVar194 * auVar8._12_4_;
      fVar195 = local_5e0._16_4_;
      auVar127._16_4_ = fVar195 * 0.0;
      fVar196 = local_5e0._20_4_;
      auVar127._20_4_ = fVar196 * 0.0;
      fVar197 = local_5e0._24_4_;
      auVar127._24_4_ = fVar197 * 0.0;
      auVar127._28_4_ = 0;
      auVar181 = vsubps_avx(auVar112,auVar127);
      auVar7 = vpermilps_avx(auVar10,0xff);
      uVar124 = auVar7._0_8_;
      local_a0._8_8_ = uVar124;
      local_a0._0_8_ = uVar124;
      local_a0._16_8_ = uVar124;
      local_a0._24_8_ = uVar124;
      auVar8 = vpermilps_avx(auVar11,0xff);
      uVar124 = auVar8._0_8_;
      local_c0._8_8_ = uVar124;
      local_c0._0_8_ = uVar124;
      local_c0._16_8_ = uVar124;
      local_c0._24_8_ = uVar124;
      auVar8 = vpermilps_avx(auVar12,0xff);
      uVar124 = auVar8._0_8_;
      local_e0._8_8_ = uVar124;
      local_e0._0_8_ = uVar124;
      local_e0._16_8_ = uVar124;
      local_e0._24_8_ = uVar124;
      auVar8 = vpermilps_avx(_local_680,0xff);
      local_100 = auVar8._0_8_;
      local_940._0_4_ = auVar92._0_4_;
      local_940._4_4_ = auVar92._4_4_;
      fStack_938 = auVar92._8_4_;
      fStack_934 = auVar92._12_4_;
      fStack_930 = auVar92._16_4_;
      fStack_92c = auVar92._20_4_;
      fStack_928 = auVar92._24_4_;
      fVar198 = auVar8._0_4_;
      auVar164._0_4_ = fVar198 * (float)local_940;
      fVar134 = auVar8._4_4_;
      auVar164._4_4_ = fVar134 * local_940._4_4_;
      auVar164._8_4_ = fVar198 * fStack_938;
      auVar164._12_4_ = fVar134 * fStack_934;
      auVar164._16_4_ = fVar198 * fStack_930;
      auVar164._20_4_ = fVar134 * fStack_92c;
      auVar164._24_4_ = fVar198 * fStack_928;
      auVar164._28_4_ = 0;
      auVar8 = vfmadd231ps_fma(auVar164,local_e0,auVar125);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar122,local_c0);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar118,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar27._4_4_ = fVar206 * fVar134;
      auVar27._0_4_ = fVar205 * fVar198;
      auVar27._8_4_ = fVar207 * fVar198;
      auVar27._12_4_ = fVar208 * fVar134;
      auVar27._16_4_ = fVar209 * fVar198;
      auVar27._20_4_ = fVar210 * fVar134;
      auVar27._24_4_ = fVar123 * fVar198;
      auVar27._28_4_ = auVar118._28_4_;
      auVar9 = vfmadd231ps_fma(auVar27,auVar131,local_e0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_4e0,local_c0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar121,local_a0);
      auVar28._4_4_ = fVar192 * fVar192;
      auVar28._0_4_ = fVar183 * fVar183;
      auVar28._8_4_ = fVar193 * fVar193;
      auVar28._12_4_ = fVar194 * fVar194;
      auVar28._16_4_ = fVar195 * fVar195;
      auVar28._20_4_ = fVar196 * fVar196;
      auVar28._24_4_ = fVar197 * fVar197;
      auVar28._28_4_ = auVar7._4_4_;
      auVar7 = vfmadd231ps_fma(auVar28,auVar19,auVar19);
      auVar22 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
      auVar29._4_4_ = auVar22._4_4_ * auVar22._4_4_ * auVar7._4_4_;
      auVar29._0_4_ = auVar22._0_4_ * auVar22._0_4_ * auVar7._0_4_;
      auVar29._8_4_ = auVar22._8_4_ * auVar22._8_4_ * auVar7._8_4_;
      auVar29._12_4_ = auVar22._12_4_ * auVar22._12_4_ * auVar7._12_4_;
      auVar29._16_4_ = auVar22._16_4_ * auVar22._16_4_ * 0.0;
      auVar29._20_4_ = auVar22._20_4_ * auVar22._20_4_ * 0.0;
      auVar29._24_4_ = auVar22._24_4_ * auVar22._24_4_ * 0.0;
      auVar29._28_4_ = auVar22._28_4_;
      auVar30._4_4_ = auVar181._4_4_ * auVar181._4_4_;
      auVar30._0_4_ = auVar181._0_4_ * auVar181._0_4_;
      auVar30._8_4_ = auVar181._8_4_ * auVar181._8_4_;
      auVar30._12_4_ = auVar181._12_4_ * auVar181._12_4_;
      auVar30._16_4_ = auVar181._16_4_ * auVar181._16_4_;
      auVar30._20_4_ = auVar181._20_4_ * auVar181._20_4_;
      auVar30._24_4_ = auVar181._24_4_ * auVar181._24_4_;
      auVar30._28_4_ = auVar181._28_4_;
      auVar22 = vcmpps_avx(auVar30,auVar29,2);
      fVar198 = auVar20._0_4_ * 4.7683716e-07;
      local_720 = (float)iVar97;
      auVar113._4_4_ = local_720;
      auVar113._0_4_ = local_720;
      auVar113._8_4_ = local_720;
      auVar113._12_4_ = local_720;
      auVar113._16_4_ = local_720;
      auVar113._20_4_ = local_720;
      auVar113._24_4_ = local_720;
      auVar113._28_4_ = local_720;
      auVar181 = vcmpps_avx(_DAT_01faff40,auVar113,1);
      auVar20 = vpermilps_avx(auVar13,0xaa);
      uVar124 = auVar20._0_8_;
      local_620._8_8_ = uVar124;
      local_620._0_8_ = uVar124;
      local_620._16_8_ = uVar124;
      local_620._24_8_ = uVar124;
      auVar20 = vpermilps_avx(auVar107,0xaa);
      uVar124 = auVar20._0_8_;
      local_120._8_8_ = uVar124;
      local_120._0_8_ = uVar124;
      local_120._16_8_ = uVar124;
      local_120._24_8_ = uVar124;
      auVar20 = vpermilps_avx(auVar136,0xaa);
      uVar124 = auVar20._0_8_;
      local_560._8_8_ = uVar124;
      local_560._0_8_ = uVar124;
      local_560._16_8_ = uVar124;
      local_560._24_8_ = uVar124;
      auVar20 = vshufps_avx(auVar108,auVar108,0xaa);
      local_140 = auVar20._0_8_;
      auVar120 = auVar181 & auVar22;
      uVar99 = *(uint *)(ray + k * 4 + 0x60);
      local_640._0_16_ = ZEXT416(uVar99);
      uStack_138 = local_140;
      uStack_130 = local_140;
      uStack_128 = local_140;
      local_7b0 = auVar10._0_8_;
      uStack_7a8 = auVar10._8_8_;
      local_7c0 = auVar11._0_8_;
      uStack_7b8 = auVar11._8_8_;
      local_7d0 = auVar12._0_8_;
      uStack_7c8 = auVar12._8_8_;
      fVar134 = local_720;
      if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar120 >> 0x7f,0) == '\0') &&
            (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar120 >> 0xbf,0) == '\0') &&
          (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar120[0x1f]) {
        auVar203 = ZEXT3264(local_6e0);
LAB_0190ba5d:
        auVar174 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar135,CONCAT420(fVar152,CONCAT416(fVar135,
                                                  CONCAT412(fVar152,CONCAT48(fVar135,uVar106)))))));
        auVar177 = ZEXT3264(CONCAT428(fVar213,CONCAT424(fVar213,CONCAT420(fVar213,CONCAT416(fVar213,
                                                  CONCAT412(fVar213,CONCAT48(fVar213,CONCAT44(
                                                  fVar213,fVar213))))))));
LAB_0190ba78:
        bVar102 = false;
        auVar158 = ZEXT3264(local_740);
        auVar131 = local_6c0;
      }
      else {
        fStack_71c = auVar108._4_4_;
        fStack_718 = auVar108._8_4_;
        fStack_714 = auVar108._12_4_;
        local_500 = vandps_avx(auVar22,auVar181);
        fVar183 = auVar20._0_4_;
        fVar192 = auVar20._4_4_;
        auVar31._4_4_ = fVar206 * fVar192;
        auVar31._0_4_ = fVar205 * fVar183;
        auVar31._8_4_ = fVar207 * fVar183;
        auVar31._12_4_ = fVar208 * fVar192;
        auVar31._16_4_ = fVar209 * fVar183;
        auVar31._20_4_ = fVar210 * fVar192;
        auVar31._24_4_ = fVar123 * fVar183;
        auVar31._28_4_ = local_500._28_4_;
        auVar20 = vfmadd213ps_fma(auVar131,local_560,auVar31);
        auVar20 = vfmadd213ps_fma(local_4e0,local_120,ZEXT1632(auVar20));
        auVar20 = vfmadd213ps_fma(auVar121,local_620,ZEXT1632(auVar20));
        auVar114._0_4_ = fVar183 * (float)local_940;
        auVar114._4_4_ = fVar192 * local_940._4_4_;
        auVar114._8_4_ = fVar183 * fStack_938;
        auVar114._12_4_ = fVar192 * fStack_934;
        auVar114._16_4_ = fVar183 * fStack_930;
        auVar114._20_4_ = fVar192 * fStack_92c;
        auVar114._24_4_ = fVar183 * fStack_928;
        auVar114._28_4_ = 0;
        auVar7 = vfmadd213ps_fma(auVar125,local_560,auVar114);
        auVar7 = vfmadd213ps_fma(auVar122,local_120,ZEXT1632(auVar7));
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1210);
        auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1694);
        auVar131 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1b18);
        fVar205 = *(float *)(catmullrom_basis0 + lVar23 + 0x1f9c);
        fVar206 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa0);
        fVar207 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa4);
        fVar208 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa8);
        fVar209 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fac);
        fVar210 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb0);
        fVar123 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb4);
        auVar169._0_4_ = fVar213 * fVar205;
        auVar169._4_4_ = fVar213 * fVar206;
        auVar169._8_4_ = fVar213 * fVar207;
        auVar169._12_4_ = fVar213 * fVar208;
        auVar169._16_4_ = fVar213 * fVar209;
        auVar169._20_4_ = fVar213 * fVar210;
        auVar169._24_4_ = fVar213 * fVar123;
        auVar169._28_4_ = 0;
        auVar32._4_4_ = fVar152 * fVar206;
        auVar32._0_4_ = fVar135 * fVar205;
        auVar32._8_4_ = fVar135 * fVar207;
        auVar32._12_4_ = fVar152 * fVar208;
        auVar32._16_4_ = fVar135 * fVar209;
        auVar32._20_4_ = fVar152 * fVar210;
        auVar32._24_4_ = fVar135 * fVar123;
        auVar32._28_4_ = *(undefined4 *)(catmullrom_basis1 + lVar23 + 0xda8);
        auVar201._0_4_ = fVar205 * fVar183;
        auVar201._4_4_ = fVar206 * fVar192;
        auVar201._8_4_ = fVar207 * fVar183;
        auVar201._12_4_ = fVar208 * fVar192;
        auVar201._16_4_ = fVar209 * fVar183;
        auVar201._20_4_ = fVar210 * fVar192;
        auVar201._24_4_ = fVar123 * fVar183;
        auVar201._28_4_ = 0;
        auVar13 = vfmadd231ps_fma(auVar169,auVar131,local_580);
        auVar107 = vfmadd231ps_fma(auVar32,auVar131,auVar185);
        auVar136 = vfmadd231ps_fma(auVar201,local_560,auVar131);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar122,auVar168);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar122,auVar220);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),local_120,auVar122);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar125,local_740);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar125,local_5a0);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),local_620,auVar125);
        fVar205 = *(float *)(catmullrom_basis1 + lVar23 + 0x1f9c);
        fVar206 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa0);
        fVar207 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa4);
        fVar208 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa8);
        fVar209 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fac);
        fVar210 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb0);
        fVar123 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb4);
        auVar33._4_4_ = fVar213 * fVar206;
        auVar33._0_4_ = fVar213 * fVar205;
        auVar33._8_4_ = fVar213 * fVar207;
        auVar33._12_4_ = fVar213 * fVar208;
        auVar33._16_4_ = fVar213 * fVar209;
        auVar33._20_4_ = fVar213 * fVar210;
        auVar33._24_4_ = fVar213 * fVar123;
        auVar33._28_4_ = fVar213;
        auVar34._4_4_ = fVar152 * fVar206;
        auVar34._0_4_ = fVar135 * fVar205;
        auVar34._8_4_ = fVar135 * fVar207;
        auVar34._12_4_ = fVar152 * fVar208;
        auVar34._16_4_ = fVar135 * fVar209;
        auVar34._20_4_ = fVar152 * fVar210;
        auVar34._24_4_ = fVar135 * fVar123;
        auVar34._28_4_ = fVar152;
        auVar35._4_4_ = fVar192 * fVar206;
        auVar35._0_4_ = fVar183 * fVar205;
        auVar35._8_4_ = fVar183 * fVar207;
        auVar35._12_4_ = fVar192 * fVar208;
        auVar35._16_4_ = fVar183 * fVar209;
        auVar35._20_4_ = fVar192 * fVar210;
        auVar35._24_4_ = fVar183 * fVar123;
        auVar35._28_4_ = fVar192;
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1b18);
        auVar108 = vfmadd231ps_fma(auVar33,auVar125,local_580);
        auVar24 = vfmadd231ps_fma(auVar34,auVar125,auVar185);
        auVar137 = vfmadd231ps_fma(auVar35,auVar125,local_560);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1694);
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar125,auVar168);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar125,auVar220);
        auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),local_120,auVar125);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1210);
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar125,local_740);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar125,local_5a0);
        auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),local_620,auVar125);
        auVar125 = vandps_avx(local_420,ZEXT1632(auVar13));
        auVar122 = vandps_avx(ZEXT1632(auVar107),local_420);
        auVar122 = vmaxps_avx(auVar125,auVar122);
        auVar125 = vandps_avx(ZEXT1632(auVar136),local_420);
        auVar125 = vmaxps_avx(auVar122,auVar125);
        auVar128._4_4_ = fVar198;
        auVar128._0_4_ = fVar198;
        auVar128._8_4_ = fVar198;
        auVar128._12_4_ = fVar198;
        auVar128._16_4_ = fVar198;
        auVar128._20_4_ = fVar198;
        auVar128._24_4_ = fVar198;
        auVar128._28_4_ = fVar198;
        auVar125 = vcmpps_avx(auVar125,auVar128,1);
        auVar131 = vblendvps_avx(ZEXT1632(auVar13),auVar19,auVar125);
        auVar121 = vblendvps_avx(ZEXT1632(auVar107),local_5e0,auVar125);
        auVar125 = vandps_avx(ZEXT1632(auVar108),local_420);
        auVar122 = vandps_avx(ZEXT1632(auVar24),local_420);
        auVar122 = vmaxps_avx(auVar125,auVar122);
        auVar125 = vandps_avx(ZEXT1632(auVar137),local_420);
        auVar125 = vmaxps_avx(auVar122,auVar125);
        auVar122 = vcmpps_avx(auVar125,auVar128,1);
        auVar125 = vblendvps_avx(ZEXT1632(auVar108),auVar19,auVar122);
        auVar122 = vblendvps_avx(ZEXT1632(auVar24),local_5e0,auVar122);
        auVar7 = vfmadd213ps_fma(auVar118,local_620,ZEXT1632(auVar7));
        auVar13 = vfmadd213ps_fma(auVar131,auVar131,ZEXT832(0) << 0x20);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,auVar121);
        auVar118 = vrsqrtps_avx(ZEXT1632(auVar13));
        fVar205 = auVar118._0_4_;
        fVar206 = auVar118._4_4_;
        fVar207 = auVar118._8_4_;
        fVar208 = auVar118._12_4_;
        fVar209 = auVar118._16_4_;
        fVar210 = auVar118._20_4_;
        fVar123 = auVar118._24_4_;
        auVar36._4_4_ = fVar206 * fVar206 * fVar206 * auVar13._4_4_ * -0.5;
        auVar36._0_4_ = fVar205 * fVar205 * fVar205 * auVar13._0_4_ * -0.5;
        auVar36._8_4_ = fVar207 * fVar207 * fVar207 * auVar13._8_4_ * -0.5;
        auVar36._12_4_ = fVar208 * fVar208 * fVar208 * auVar13._12_4_ * -0.5;
        auVar36._16_4_ = fVar209 * fVar209 * fVar209 * -0.0;
        auVar36._20_4_ = fVar210 * fVar210 * fVar210 * -0.0;
        auVar36._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar36._28_4_ = 0;
        auVar219._8_4_ = 0x3fc00000;
        auVar219._0_8_ = 0x3fc000003fc00000;
        auVar219._12_4_ = 0x3fc00000;
        auVar219._16_4_ = 0x3fc00000;
        auVar219._20_4_ = 0x3fc00000;
        auVar219._24_4_ = 0x3fc00000;
        auVar219._28_4_ = 0x3fc00000;
        auVar13 = vfmadd231ps_fma(auVar36,auVar219,auVar118);
        fVar205 = auVar13._0_4_;
        fVar206 = auVar13._4_4_;
        auVar37._4_4_ = auVar121._4_4_ * fVar206;
        auVar37._0_4_ = auVar121._0_4_ * fVar205;
        fVar207 = auVar13._8_4_;
        auVar37._8_4_ = auVar121._8_4_ * fVar207;
        fVar208 = auVar13._12_4_;
        auVar37._12_4_ = auVar121._12_4_ * fVar208;
        auVar37._16_4_ = auVar121._16_4_ * 0.0;
        auVar37._20_4_ = auVar121._20_4_ * 0.0;
        auVar37._24_4_ = auVar121._24_4_ * 0.0;
        auVar37._28_4_ = auVar118._28_4_;
        auVar38._4_4_ = -auVar131._4_4_ * fVar206;
        auVar38._0_4_ = -auVar131._0_4_ * fVar205;
        auVar38._8_4_ = -auVar131._8_4_ * fVar207;
        auVar38._12_4_ = -auVar131._12_4_ * fVar208;
        auVar38._16_4_ = -auVar131._16_4_ * 0.0;
        auVar38._20_4_ = -auVar131._20_4_ * 0.0;
        auVar38._24_4_ = -auVar131._24_4_ * 0.0;
        auVar38._28_4_ = 0;
        auVar13 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar122,auVar122);
        auVar118 = vrsqrtps_avx(ZEXT1632(auVar13));
        auVar131 = ZEXT1632(CONCAT412(fVar208 * 0.0,
                                      CONCAT48(fVar207 * 0.0,CONCAT44(fVar206 * 0.0,fVar205 * 0.0)))
                           );
        fVar205 = auVar118._0_4_;
        fVar206 = auVar118._4_4_;
        fVar207 = auVar118._8_4_;
        fVar208 = auVar118._12_4_;
        fVar209 = auVar118._16_4_;
        fVar210 = auVar118._20_4_;
        fVar123 = auVar118._24_4_;
        auVar39._4_4_ = fVar206 * fVar206 * fVar206 * auVar13._4_4_ * -0.5;
        auVar39._0_4_ = fVar205 * fVar205 * fVar205 * auVar13._0_4_ * -0.5;
        auVar39._8_4_ = fVar207 * fVar207 * fVar207 * auVar13._8_4_ * -0.5;
        auVar39._12_4_ = fVar208 * fVar208 * fVar208 * auVar13._12_4_ * -0.5;
        auVar39._16_4_ = fVar209 * fVar209 * fVar209 * -0.0;
        auVar39._20_4_ = fVar210 * fVar210 * fVar210 * -0.0;
        auVar39._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar39._28_4_ = 0xbf000000;
        auVar13 = vfmadd231ps_fma(auVar39,auVar219,auVar118);
        fVar205 = auVar13._0_4_;
        fVar206 = auVar13._4_4_;
        auVar40._4_4_ = fVar206 * auVar122._4_4_;
        auVar40._0_4_ = fVar205 * auVar122._0_4_;
        fVar207 = auVar13._8_4_;
        auVar40._8_4_ = fVar207 * auVar122._8_4_;
        fVar208 = auVar13._12_4_;
        auVar40._12_4_ = fVar208 * auVar122._12_4_;
        auVar40._16_4_ = auVar122._16_4_ * 0.0;
        auVar40._20_4_ = auVar122._20_4_ * 0.0;
        auVar40._24_4_ = auVar122._24_4_ * 0.0;
        auVar40._28_4_ = 0;
        auVar41._4_4_ = fVar206 * -auVar125._4_4_;
        auVar41._0_4_ = fVar205 * -auVar125._0_4_;
        auVar41._8_4_ = fVar207 * -auVar125._8_4_;
        auVar41._12_4_ = fVar208 * -auVar125._12_4_;
        auVar41._16_4_ = -auVar125._16_4_ * 0.0;
        auVar41._20_4_ = -auVar125._20_4_ * 0.0;
        auVar41._24_4_ = -auVar125._24_4_ * 0.0;
        auVar41._28_4_ = 0x3fc00000;
        auVar42._28_4_ = auVar118._28_4_;
        auVar42._0_28_ =
             ZEXT1628(CONCAT412(fVar208 * 0.0,
                                CONCAT48(fVar207 * 0.0,CONCAT44(fVar206 * 0.0,fVar205 * 0.0))));
        auVar13 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar8),local_480);
        auVar125 = ZEXT1632(auVar8);
        auVar107 = vfmadd213ps_fma(auVar38,auVar125,local_5c0);
        auVar136 = vfmadd213ps_fma(auVar131,auVar125,ZEXT1632(auVar7));
        auVar137 = vfnmadd213ps_fma(auVar37,auVar125,local_480);
        auVar108 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar9),_local_4a0);
        auVar138 = vfnmadd213ps_fma(auVar38,auVar125,local_5c0);
        auVar125 = ZEXT1632(auVar9);
        auVar24 = vfmadd213ps_fma(auVar41,auVar125,local_4c0);
        auVar165 = ZEXT1632(auVar8);
        auVar159 = vfnmadd231ps_fma(ZEXT1632(auVar7),auVar165,auVar131);
        auVar7 = vfmadd213ps_fma(auVar42,auVar125,ZEXT1632(auVar20));
        auVar153 = vfnmadd213ps_fma(auVar40,auVar125,_local_4a0);
        auVar154 = vfnmadd213ps_fma(auVar41,auVar125,local_4c0);
        auVar175 = vfnmadd231ps_fma(ZEXT1632(auVar20),ZEXT1632(auVar9),auVar42);
        auVar125 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar138));
        auVar122 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar159));
        auVar146._0_4_ = auVar159._0_4_ * auVar125._0_4_;
        auVar146._4_4_ = auVar159._4_4_ * auVar125._4_4_;
        auVar146._8_4_ = auVar159._8_4_ * auVar125._8_4_;
        auVar146._12_4_ = auVar159._12_4_ * auVar125._12_4_;
        auVar146._16_4_ = auVar125._16_4_ * 0.0;
        auVar146._20_4_ = auVar125._20_4_ * 0.0;
        auVar146._24_4_ = auVar125._24_4_ * 0.0;
        auVar146._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar146,ZEXT1632(auVar138),auVar122);
        auVar43._4_4_ = auVar137._4_4_ * auVar122._4_4_;
        auVar43._0_4_ = auVar137._0_4_ * auVar122._0_4_;
        auVar43._8_4_ = auVar137._8_4_ * auVar122._8_4_;
        auVar43._12_4_ = auVar137._12_4_ * auVar122._12_4_;
        auVar43._16_4_ = auVar122._16_4_ * 0.0;
        auVar43._20_4_ = auVar122._20_4_ * 0.0;
        auVar43._24_4_ = auVar122._24_4_ * 0.0;
        auVar43._28_4_ = auVar122._28_4_;
        auVar181 = ZEXT1632(auVar137);
        auVar122 = vsubps_avx(ZEXT1632(auVar108),auVar181);
        auVar20 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar159),auVar122);
        auVar44._4_4_ = auVar138._4_4_ * auVar122._4_4_;
        auVar44._0_4_ = auVar138._0_4_ * auVar122._0_4_;
        auVar44._8_4_ = auVar138._8_4_ * auVar122._8_4_;
        auVar44._12_4_ = auVar138._12_4_ * auVar122._12_4_;
        auVar44._16_4_ = auVar122._16_4_ * 0.0;
        auVar44._20_4_ = auVar122._20_4_ * 0.0;
        auVar44._24_4_ = auVar122._24_4_ * 0.0;
        auVar44._28_4_ = auVar122._28_4_;
        auVar137 = vfmsub231ps_fma(auVar44,auVar181,auVar125);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar137),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar186 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
        auVar125 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar13),auVar186);
        auVar122 = vblendvps_avx(ZEXT1632(auVar154),ZEXT1632(auVar107),auVar186);
        auVar118 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar136),auVar186);
        auVar131 = vblendvps_avx(auVar181,ZEXT1632(auVar108),auVar186);
        auVar121 = vblendvps_avx(ZEXT1632(auVar138),ZEXT1632(auVar24),auVar186);
        auVar22 = vblendvps_avx(ZEXT1632(auVar159),ZEXT1632(auVar7),auVar186);
        auVar181 = vblendvps_avx(ZEXT1632(auVar108),auVar181,auVar186);
        auVar19 = vblendvps_avx(ZEXT1632(auVar24),ZEXT1632(auVar138),auVar186);
        auVar20 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
        auVar120 = vblendvps_avx(ZEXT1632(auVar7),ZEXT1632(auVar159),auVar186);
        auVar187 = vsubps_avx(auVar181,auVar125);
        auVar19 = vsubps_avx(auVar19,auVar122);
        auVar202 = vsubps_avx(auVar120,auVar118);
        auVar144 = vsubps_avx(auVar125,auVar131);
        auVar145 = vsubps_avx(auVar122,auVar121);
        auVar155 = vsubps_avx(auVar118,auVar22);
        auVar45._4_4_ = auVar202._4_4_ * auVar125._4_4_;
        auVar45._0_4_ = auVar202._0_4_ * auVar125._0_4_;
        auVar45._8_4_ = auVar202._8_4_ * auVar125._8_4_;
        auVar45._12_4_ = auVar202._12_4_ * auVar125._12_4_;
        auVar45._16_4_ = auVar202._16_4_ * auVar125._16_4_;
        auVar45._20_4_ = auVar202._20_4_ * auVar125._20_4_;
        auVar45._24_4_ = auVar202._24_4_ * auVar125._24_4_;
        auVar45._28_4_ = auVar120._28_4_;
        auVar7 = vfmsub231ps_fma(auVar45,auVar118,auVar187);
        auVar46._4_4_ = auVar187._4_4_ * auVar122._4_4_;
        auVar46._0_4_ = auVar187._0_4_ * auVar122._0_4_;
        auVar46._8_4_ = auVar187._8_4_ * auVar122._8_4_;
        auVar46._12_4_ = auVar187._12_4_ * auVar122._12_4_;
        auVar46._16_4_ = auVar187._16_4_ * auVar122._16_4_;
        auVar46._20_4_ = auVar187._20_4_ * auVar122._20_4_;
        auVar46._24_4_ = auVar187._24_4_ * auVar122._24_4_;
        auVar46._28_4_ = auVar181._28_4_;
        auVar8 = vfmsub231ps_fma(auVar46,auVar125,auVar19);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
        auVar115._0_4_ = auVar19._0_4_ * auVar118._0_4_;
        auVar115._4_4_ = auVar19._4_4_ * auVar118._4_4_;
        auVar115._8_4_ = auVar19._8_4_ * auVar118._8_4_;
        auVar115._12_4_ = auVar19._12_4_ * auVar118._12_4_;
        auVar115._16_4_ = auVar19._16_4_ * auVar118._16_4_;
        auVar115._20_4_ = auVar19._20_4_ * auVar118._20_4_;
        auVar115._24_4_ = auVar19._24_4_ * auVar118._24_4_;
        auVar115._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar115,auVar122,auVar202);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar116._0_4_ = auVar155._0_4_ * auVar131._0_4_;
        auVar116._4_4_ = auVar155._4_4_ * auVar131._4_4_;
        auVar116._8_4_ = auVar155._8_4_ * auVar131._8_4_;
        auVar116._12_4_ = auVar155._12_4_ * auVar131._12_4_;
        auVar116._16_4_ = auVar155._16_4_ * auVar131._16_4_;
        auVar116._20_4_ = auVar155._20_4_ * auVar131._20_4_;
        auVar116._24_4_ = auVar155._24_4_ * auVar131._24_4_;
        auVar116._28_4_ = 0;
        auVar7 = vfmsub231ps_fma(auVar116,auVar144,auVar22);
        auVar47._4_4_ = auVar145._4_4_ * auVar22._4_4_;
        auVar47._0_4_ = auVar145._0_4_ * auVar22._0_4_;
        auVar47._8_4_ = auVar145._8_4_ * auVar22._8_4_;
        auVar47._12_4_ = auVar145._12_4_ * auVar22._12_4_;
        auVar47._16_4_ = auVar145._16_4_ * auVar22._16_4_;
        auVar47._20_4_ = auVar145._20_4_ * auVar22._20_4_;
        auVar47._24_4_ = auVar145._24_4_ * auVar22._24_4_;
        auVar47._28_4_ = auVar22._28_4_;
        auVar13 = vfmsub231ps_fma(auVar47,auVar121,auVar155);
        auVar48._4_4_ = auVar144._4_4_ * auVar121._4_4_;
        auVar48._0_4_ = auVar144._0_4_ * auVar121._0_4_;
        auVar48._8_4_ = auVar144._8_4_ * auVar121._8_4_;
        auVar48._12_4_ = auVar144._12_4_ * auVar121._12_4_;
        auVar48._16_4_ = auVar144._16_4_ * auVar121._16_4_;
        auVar48._20_4_ = auVar144._20_4_ * auVar121._20_4_;
        auVar48._24_4_ = auVar144._24_4_ * auVar121._24_4_;
        auVar48._28_4_ = auVar121._28_4_;
        auVar107 = vfmsub231ps_fma(auVar48,auVar145,auVar131);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar131 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar13));
        auVar131 = vcmpps_avx(auVar131,ZEXT832(0) << 0x20,2);
        auVar7 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
        auVar20 = vpand_avx(auVar20,auVar7);
        auVar131 = vpmovsxwd_avx2(auVar20);
        if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar131 >> 0x7f,0) == '\0') &&
              (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar131 >> 0xbf,0) == '\0') &&
            (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar131[0x1f]) {
          auVar190 = ZEXT864(0) << 0x20;
LAB_0190ceb9:
          auVar174 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
          auVar216 = ZEXT3264(local_6c0);
          auVar203 = ZEXT3264(local_6e0);
        }
        else {
          auVar49._4_4_ = auVar19._4_4_ * auVar155._4_4_;
          auVar49._0_4_ = auVar19._0_4_ * auVar155._0_4_;
          auVar49._8_4_ = auVar19._8_4_ * auVar155._8_4_;
          auVar49._12_4_ = auVar19._12_4_ * auVar155._12_4_;
          auVar49._16_4_ = auVar19._16_4_ * auVar155._16_4_;
          auVar49._20_4_ = auVar19._20_4_ * auVar155._20_4_;
          auVar49._24_4_ = auVar19._24_4_ * auVar155._24_4_;
          auVar49._28_4_ = auVar131._28_4_;
          auVar108 = vfmsub231ps_fma(auVar49,auVar145,auVar202);
          auVar129._0_4_ = auVar144._0_4_ * auVar202._0_4_;
          auVar129._4_4_ = auVar144._4_4_ * auVar202._4_4_;
          auVar129._8_4_ = auVar144._8_4_ * auVar202._8_4_;
          auVar129._12_4_ = auVar144._12_4_ * auVar202._12_4_;
          auVar129._16_4_ = auVar144._16_4_ * auVar202._16_4_;
          auVar129._20_4_ = auVar144._20_4_ * auVar202._20_4_;
          auVar129._24_4_ = auVar144._24_4_ * auVar202._24_4_;
          auVar129._28_4_ = 0;
          auVar136 = vfmsub231ps_fma(auVar129,auVar187,auVar155);
          auVar50._4_4_ = auVar187._4_4_ * auVar145._4_4_;
          auVar50._0_4_ = auVar187._0_4_ * auVar145._0_4_;
          auVar50._8_4_ = auVar187._8_4_ * auVar145._8_4_;
          auVar50._12_4_ = auVar187._12_4_ * auVar145._12_4_;
          auVar50._16_4_ = auVar187._16_4_ * auVar145._16_4_;
          auVar50._20_4_ = auVar187._20_4_ * auVar145._20_4_;
          auVar50._24_4_ = auVar187._24_4_ * auVar145._24_4_;
          auVar50._28_4_ = auVar187._28_4_;
          auVar24 = vfmsub231ps_fma(auVar50,auVar144,auVar19);
          auVar7 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar136),ZEXT1632(auVar24));
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar108),_DAT_01faff00);
          auVar131 = vrcpps_avx(ZEXT1632(auVar107));
          auVar212._8_4_ = 0x3f800000;
          auVar212._0_8_ = 0x3f8000003f800000;
          auVar212._12_4_ = 0x3f800000;
          auVar212._16_4_ = 0x3f800000;
          auVar212._20_4_ = 0x3f800000;
          auVar212._24_4_ = 0x3f800000;
          auVar212._28_4_ = 0x3f800000;
          auVar7 = vfnmadd213ps_fma(auVar131,ZEXT1632(auVar107),auVar212);
          auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar131,auVar131);
          auVar51._4_4_ = auVar24._4_4_ * auVar118._4_4_;
          auVar51._0_4_ = auVar24._0_4_ * auVar118._0_4_;
          auVar51._8_4_ = auVar24._8_4_ * auVar118._8_4_;
          auVar51._12_4_ = auVar24._12_4_ * auVar118._12_4_;
          auVar51._16_4_ = auVar118._16_4_ * 0.0;
          auVar51._20_4_ = auVar118._20_4_ * 0.0;
          auVar51._24_4_ = auVar118._24_4_ * 0.0;
          auVar51._28_4_ = auVar118._28_4_;
          auVar136 = vfmadd231ps_fma(auVar51,auVar122,ZEXT1632(auVar136));
          auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),ZEXT1632(auVar108),auVar125);
          fVar205 = auVar7._0_4_;
          fVar206 = auVar7._4_4_;
          fVar207 = auVar7._8_4_;
          fVar208 = auVar7._12_4_;
          auVar52._28_4_ = auVar122._28_4_;
          auVar52._0_28_ =
               ZEXT1628(CONCAT412(fVar208 * auVar136._12_4_,
                                  CONCAT48(fVar207 * auVar136._8_4_,
                                           CONCAT44(fVar206 * auVar136._4_4_,
                                                    fVar205 * auVar136._0_4_))));
          auVar117._4_4_ = uVar99;
          auVar117._0_4_ = uVar99;
          auVar117._8_4_ = uVar99;
          auVar117._12_4_ = uVar99;
          auVar117._16_4_ = uVar99;
          auVar117._20_4_ = uVar99;
          auVar117._24_4_ = uVar99;
          auVar117._28_4_ = uVar99;
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar130._4_4_ = uVar4;
          auVar130._0_4_ = uVar4;
          auVar130._8_4_ = uVar4;
          auVar130._12_4_ = uVar4;
          auVar130._16_4_ = uVar4;
          auVar130._20_4_ = uVar4;
          auVar130._24_4_ = uVar4;
          auVar130._28_4_ = uVar4;
          auVar125 = vcmpps_avx(auVar117,auVar52,2);
          auVar122 = vcmpps_avx(auVar52,auVar130,2);
          auVar125 = vandps_avx(auVar122,auVar125);
          auVar7 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
          auVar20 = vpand_avx(auVar20,auVar7);
          auVar125 = vpmovsxwd_avx2(auVar20);
          auVar190 = ZEXT864(0) << 0x20;
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar125 >> 0x7f,0) == '\0') &&
                (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0xbf,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar125[0x1f]) goto LAB_0190ceb9;
          auVar125 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar107),4);
          auVar7 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
          auVar20 = vpand_avx(auVar20,auVar7);
          auVar125 = vpmovsxwd_avx2(auVar20);
          auVar174 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
          auVar216 = ZEXT3264(local_6c0);
          auVar203 = ZEXT3264(local_6e0);
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0x7f,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0xbf,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar125[0x1f] < '\0') {
            auVar118 = ZEXT1632(CONCAT412(fVar208 * auVar8._12_4_,
                                          CONCAT48(fVar207 * auVar8._8_4_,
                                                   CONCAT44(fVar206 * auVar8._4_4_,
                                                            fVar205 * auVar8._0_4_))));
            auVar131 = ZEXT1632(CONCAT412(fVar208 * auVar13._12_4_,
                                          CONCAT48(fVar207 * auVar13._8_4_,
                                                   CONCAT44(fVar206 * auVar13._4_4_,
                                                            fVar205 * auVar13._0_4_))));
            auVar166._8_4_ = 0x3f800000;
            auVar166._0_8_ = 0x3f8000003f800000;
            auVar166._12_4_ = 0x3f800000;
            auVar166._16_4_ = 0x3f800000;
            auVar166._20_4_ = 0x3f800000;
            auVar166._24_4_ = 0x3f800000;
            auVar166._28_4_ = 0x3f800000;
            auVar122 = vsubps_avx(auVar166,auVar118);
            auVar122 = vblendvps_avx(auVar122,auVar118,auVar186);
            auVar216 = ZEXT3264(auVar122);
            auVar122 = vsubps_avx(auVar166,auVar131);
            local_520 = vblendvps_avx(auVar122,auVar131,auVar186);
            auVar174 = ZEXT3264(auVar125);
            auVar203 = ZEXT3264(auVar52);
          }
        }
        local_6c0 = auVar216._0_32_;
        auVar125 = auVar174._0_32_;
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0x7f,0) == '\0') &&
              (auVar174 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar125 >> 0xbf,0) == '\0') &&
            (auVar174 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar174[0x1f]) goto LAB_0190ba5d;
        auVar122 = vsubps_avx(ZEXT1632(auVar9),auVar165);
        auVar20 = vfmadd213ps_fma(auVar122,local_6c0,auVar165);
        fVar205 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar53._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar205;
        auVar53._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar205;
        auVar53._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar205;
        auVar53._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar205;
        auVar53._16_4_ = fVar205 * 0.0;
        auVar53._20_4_ = fVar205 * 0.0;
        auVar53._24_4_ = fVar205 * 0.0;
        auVar53._28_4_ = 0;
        local_6e0 = auVar203._0_32_;
        auVar122 = vcmpps_avx(local_6e0,auVar53,6);
        auVar118 = auVar125 & auVar122;
        auVar174 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar135,CONCAT420(fVar152,CONCAT416(fVar135,
                                                  CONCAT412(fVar152,CONCAT48(fVar135,uVar106)))))));
        auVar177 = ZEXT3264(CONCAT428(fVar213,CONCAT424(fVar213,CONCAT420(fVar213,CONCAT416(fVar213,
                                                  CONCAT412(fVar213,CONCAT48(fVar213,CONCAT44(
                                                  fVar213,fVar213))))))));
        auVar131 = local_6c0;
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          auVar132._8_4_ = 0xbf800000;
          auVar132._0_8_ = 0xbf800000bf800000;
          auVar132._12_4_ = 0xbf800000;
          auVar132._16_4_ = 0xbf800000;
          auVar132._20_4_ = 0xbf800000;
          auVar132._24_4_ = 0xbf800000;
          auVar132._28_4_ = 0xbf800000;
          auVar147._8_4_ = 0x40000000;
          auVar147._0_8_ = 0x4000000040000000;
          auVar147._12_4_ = 0x40000000;
          auVar147._16_4_ = 0x40000000;
          auVar147._20_4_ = 0x40000000;
          auVar147._24_4_ = 0x40000000;
          auVar147._28_4_ = 0x40000000;
          auVar20 = vfmadd213ps_fma(local_520,auVar147,auVar132);
          local_3e0 = ZEXT1632(auVar20);
          local_3a0 = 0;
          local_390 = local_7b0;
          uStack_388 = uStack_7a8;
          local_380 = local_7c0;
          uStack_378 = uStack_7b8;
          local_370 = local_7d0;
          uStack_368 = uStack_7c8;
          local_520 = local_3e0;
          if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            auVar158 = ZEXT3264(local_740);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar102 = true, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar125 = vandps_avx(auVar122,auVar125);
              fVar205 = 1.0 / local_720;
              local_320[0] = fVar205 * (auVar216._0_4_ + 0.0);
              local_320[1] = fVar205 * (auVar216._4_4_ + 1.0);
              local_320[2] = fVar205 * (auVar216._8_4_ + 2.0);
              local_320[3] = fVar205 * (auVar216._12_4_ + 3.0);
              fStack_310 = fVar205 * (auVar216._16_4_ + 4.0);
              fStack_30c = fVar205 * (auVar216._20_4_ + 5.0);
              fStack_308 = fVar205 * (auVar216._24_4_ + 6.0);
              fStack_304 = auVar216._28_4_ + 7.0;
              local_520._0_8_ = auVar20._0_8_;
              local_520._8_8_ = auVar20._8_8_;
              local_300 = local_520._0_8_;
              uStack_2f8 = local_520._8_8_;
              uStack_2f0 = 0;
              uStack_2e8 = 0;
              local_2e0 = local_6e0;
              uVar99 = vmovmskps_avx(auVar125);
              if (uVar99 == 0) goto LAB_0190bb65;
              uVar98 = 0;
              uVar103 = (ulong)(uVar99 & 0xff);
              for (uVar100 = uVar103; (uVar100 & 1) == 0;
                  uVar100 = uVar100 >> 1 | 0x8000000000000000) {
                uVar98 = uVar98 + 1;
              }
              local_8a0._0_4_ = local_8a0._4_4_;
              local_8a0._8_4_ = local_8a0._4_4_;
              local_8a0._12_4_ = local_8a0._4_4_;
              local_8a0._16_4_ = local_8a0._4_4_;
              local_8a0._20_4_ = local_8a0._4_4_;
              local_8a0._24_4_ = local_8a0._4_4_;
              local_8a0._28_4_ = local_8a0._4_4_;
              local_820 = CONCAT44((uint)uStack_818,(uint)uStack_818);
              uStack_818._4_4_ = (uint)uStack_818;
              uStack_810._0_4_ = (uint)uStack_818;
              uStack_810._4_4_ = (uint)uStack_818;
              auVar94 = _local_820;
              uStack_808._0_4_ = (uint)uStack_818;
              uStack_808._4_4_ = (uint)uStack_818;
              auVar125 = _local_820;
              local_700 = ZEXT1632(CONCAT124(auVar9._4_12_,*(undefined4 *)(ray + k * 4 + 0x100)));
              local_400 = local_6c0;
              local_3c0 = local_6e0;
              local_39c = iVar97;
              do {
                fVar205 = local_320[uVar98];
                auVar109._4_4_ = fVar205;
                auVar109._0_4_ = fVar205;
                auVar109._8_4_ = fVar205;
                auVar109._12_4_ = fVar205;
                local_260._16_4_ = fVar205;
                local_260._0_16_ = auVar109;
                local_260._20_4_ = fVar205;
                local_260._24_4_ = fVar205;
                local_260._28_4_ = fVar205;
                local_240 = *(undefined4 *)((long)&local_300 + uVar98 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar98 * 4);
                fVar206 = 1.0 - fVar205;
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,
                                          ZEXT416(0xc0a00000));
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * fVar205 * 3.0)),
                                         ZEXT416((uint)(fVar205 + fVar205)),auVar20);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,
                                          ZEXT416(0x40000000));
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * -3.0)),
                                          ZEXT416((uint)(fVar206 + fVar206)),auVar20);
                auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar205 * (fVar206 + fVar206))),
                                          ZEXT416((uint)fVar206),ZEXT416((uint)fVar206));
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * fVar205)),auVar109,
                                         ZEXT416((uint)(fVar206 * -2.0)));
                fVar205 = auVar20._0_4_ * 0.5;
                fVar206 = auVar8._0_4_ * 0.5;
                auVar160._0_4_ = fVar206 * (float)local_680._0_4_;
                auVar160._4_4_ = fVar206 * (float)local_680._4_4_;
                auVar160._8_4_ = fVar206 * fStack_678;
                auVar160._12_4_ = fVar206 * fStack_674;
                auVar139._4_4_ = fVar205;
                auVar139._0_4_ = fVar205;
                auVar139._8_4_ = fVar205;
                auVar139._12_4_ = fVar205;
                auVar20 = vfmadd132ps_fma(auVar139,auVar160,auVar12);
                fVar205 = auVar7._0_4_ * 0.5;
                auVar161._4_4_ = fVar205;
                auVar161._0_4_ = fVar205;
                auVar161._8_4_ = fVar205;
                auVar161._12_4_ = fVar205;
                auVar20 = vfmadd132ps_fma(auVar161,auVar20,auVar11);
                local_790.context = context->user;
                fVar205 = auVar9._0_4_ * 0.5;
                auVar140._4_4_ = fVar205;
                auVar140._0_4_ = fVar205;
                auVar140._8_4_ = fVar205;
                auVar140._12_4_ = fVar205;
                auVar7 = vfmadd132ps_fma(auVar140,auVar20,auVar10);
                local_2c0 = auVar7._0_4_;
                uStack_2bc = local_2c0;
                uStack_2b8 = local_2c0;
                uStack_2b4 = local_2c0;
                uStack_2b0 = local_2c0;
                uStack_2ac = local_2c0;
                uStack_2a8 = local_2c0;
                uStack_2a4 = local_2c0;
                auVar20 = vmovshdup_avx(auVar7);
                local_2a0 = auVar20._0_8_;
                uStack_298 = local_2a0;
                uStack_290 = local_2a0;
                uStack_288 = local_2a0;
                auVar20 = vshufps_avx(auVar7,auVar7,0xaa);
                auVar141._0_8_ = auVar20._0_8_;
                auVar141._8_8_ = auVar141._0_8_;
                auVar148._16_8_ = auVar141._0_8_;
                auVar148._0_16_ = auVar141;
                auVar148._24_8_ = auVar141._0_8_;
                local_280 = auVar148;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                uStack_810 = auVar94._16_8_;
                uStack_808 = auVar125._24_8_;
                local_220 = local_820;
                uStack_218 = uStack_818;
                uStack_210 = uStack_810;
                uStack_208 = uStack_808;
                local_200 = local_8a0;
                vpcmpeqd_avx2(local_8a0,local_8a0);
                local_1e0 = (local_790.context)->instID[0];
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = (local_790.context)->instPrimID[0];
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_6a0 = local_440;
                local_790.valid = (int *)local_6a0;
                local_790.geometryUserPtr = pGVar15->userPtr;
                local_790.hit = (RTCHitN *)&local_2c0;
                local_790.N = 8;
                local_790.ray = (RTCRayN *)ray;
                if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar148 = ZEXT1632(auVar141);
                  (*pGVar15->occlusionFilterN)(&local_790);
                  auVar203 = ZEXT3264(local_6e0);
                  auVar216 = ZEXT3264(local_6c0);
                  auVar190 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar134 = local_720;
                }
                auVar118 = vpcmpeqd_avx2(auVar190._0_32_,local_6a0);
                auVar131 = vpcmpeqd_avx2(auVar148,auVar148);
                auVar122 = auVar131 & ~auVar118;
                if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar122 >> 0x7f,0) == '\0') &&
                      (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar122 >> 0xbf,0) == '\0') &&
                    (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar122[0x1f]) {
                  auVar118 = auVar118 ^ auVar131;
                }
                else {
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar15->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var18)(&local_790);
                    auVar203 = ZEXT3264(local_6e0);
                    auVar216 = ZEXT3264(local_6c0);
                    auVar190 = ZEXT1664(ZEXT816(0) << 0x40);
                    fVar134 = local_720;
                  }
                  auVar122 = vpcmpeqd_avx2(auVar190._0_32_,local_6a0);
                  auVar118 = vpcmpeqd_avx2(local_6a0,local_6a0);
                  auVar118 = auVar122 ^ auVar118;
                  auVar149._8_4_ = 0xff800000;
                  auVar149._0_8_ = 0xff800000ff800000;
                  auVar149._12_4_ = 0xff800000;
                  auVar149._16_4_ = 0xff800000;
                  auVar149._20_4_ = 0xff800000;
                  auVar149._24_4_ = 0xff800000;
                  auVar149._28_4_ = 0xff800000;
                  auVar122 = vblendvps_avx(auVar149,*(undefined1 (*) [32])(local_790.ray + 0x100),
                                           auVar122);
                  *(undefined1 (*) [32])(local_790.ray + 0x100) = auVar122;
                }
                auVar174 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar135,CONCAT420(fVar152,CONCAT416(
                                                  fVar135,CONCAT412(fVar152,CONCAT48(fVar135,uVar106
                                                                                    )))))));
                auVar177 = ZEXT3264(CONCAT428(fVar213,CONCAT424(fVar213,CONCAT420(fVar213,CONCAT416(
                                                  fVar213,CONCAT412(fVar213,CONCAT48(fVar213,
                                                  CONCAT44(fVar213,fVar213))))))));
                auVar158 = ZEXT3264(local_740);
                auVar131 = auVar216._0_32_;
                if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar118 >> 0x7f,0) != '\0') ||
                      (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar118 >> 0xbf,0) != '\0') ||
                    (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar118[0x1f] < '\0') {
                  bVar102 = true;
                  break;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = local_700._0_4_;
                uVar100 = uVar98 & 0x3f;
                bVar102 = false;
                uVar98 = 0;
                uVar103 = uVar103 ^ 1L << uVar100;
                for (uVar100 = uVar103; (uVar100 & 1) == 0;
                    uVar100 = uVar100 >> 1 | 0x8000000000000000) {
                  uVar98 = uVar98 + 1;
                }
              } while (uVar103 != 0);
            }
            goto LAB_0190ba81;
          }
          goto LAB_0190ba78;
        }
LAB_0190bb65:
        auVar158 = ZEXT3264(local_740);
        bVar102 = false;
      }
LAB_0190ba81:
      local_6c0 = auVar131;
      auVar216 = ZEXT3264(local_920);
      auVar190 = ZEXT3264(local_760);
      local_6e0 = auVar203._0_32_;
      if (8 < iVar97) {
        local_4c0._4_4_ = iVar97;
        local_4c0._0_4_ = iVar97;
        local_4c0._8_4_ = iVar97;
        local_4c0._12_4_ = iVar97;
        local_4c0._16_4_ = iVar97;
        local_4c0._20_4_ = iVar97;
        local_4c0._24_4_ = iVar97;
        local_4c0._28_4_ = iVar97;
        local_500._4_4_ = local_640._0_4_;
        local_500._0_4_ = local_640._0_4_;
        local_500._8_4_ = local_640._0_4_;
        local_500._12_4_ = local_640._0_4_;
        local_500._16_4_ = local_640._0_4_;
        local_500._20_4_ = local_640._0_4_;
        local_500._24_4_ = local_640._0_4_;
        local_500._28_4_ = local_640._0_4_;
        local_1a0 = 1.0 / fVar134;
        fStack_19c = local_1a0;
        fStack_198 = local_1a0;
        fStack_194 = local_1a0;
        fStack_190 = local_1a0;
        fStack_18c = local_1a0;
        fStack_188 = local_1a0;
        fStack_184 = local_1a0;
        local_160 = local_8a0._4_4_;
        uStack_15c = local_8a0._4_4_;
        uStack_158 = local_8a0._4_4_;
        uStack_154 = local_8a0._4_4_;
        uStack_150 = local_8a0._4_4_;
        uStack_14c = local_8a0._4_4_;
        uStack_148 = local_8a0._4_4_;
        uStack_144 = local_8a0._4_4_;
        local_180 = local_600._0_4_;
        uStack_17c = local_600._0_4_;
        uStack_178 = local_600._0_4_;
        uStack_174 = local_600._0_4_;
        uStack_170 = local_600._0_4_;
        uStack_16c = local_600._0_4_;
        uStack_168 = local_600._0_4_;
        uStack_164 = local_600._0_4_;
        lVar104 = 8;
        local_720 = fVar198;
        fStack_71c = fVar198;
        fStack_718 = fVar198;
        fStack_714 = fVar198;
        fStack_710 = fVar198;
        fStack_70c = fVar198;
        fStack_708 = fVar198;
        fStack_704 = fVar198;
        do {
          auVar144 = auVar216._0_32_;
          auVar186 = auVar190._0_32_;
          auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar104 * 4 + lVar23);
          auVar122 = *(undefined1 (*) [32])(lVar23 + 0x21b37f0 + lVar104 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar23 + 0x21b3c74 + lVar104 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar23 + 0x21b40f8 + lVar104 * 4);
          fVar123 = *(float *)*pauVar2;
          fVar134 = *(float *)(*pauVar2 + 4);
          fVar183 = *(float *)(*pauVar2 + 8);
          fVar192 = *(float *)(*pauVar2 + 0xc);
          fVar193 = *(float *)(*pauVar2 + 0x10);
          fVar194 = *(float *)(*pauVar2 + 0x14);
          fVar195 = *(float *)(*pauVar2 + 0x18);
          auVar92 = *(undefined1 (*) [28])*pauVar2;
          auVar204._0_4_ = fVar123 * auVar177._0_4_;
          auVar204._4_4_ = fVar134 * auVar177._4_4_;
          auVar204._8_4_ = fVar183 * auVar177._8_4_;
          auVar204._12_4_ = fVar192 * auVar177._12_4_;
          auVar204._16_4_ = fVar193 * auVar177._16_4_;
          auVar204._20_4_ = fVar194 * auVar177._20_4_;
          auVar204._28_36_ = auVar203._28_36_;
          auVar204._24_4_ = fVar195 * auVar177._24_4_;
          auVar191._0_4_ = fVar123 * auVar174._0_4_;
          auVar191._4_4_ = fVar134 * auVar174._4_4_;
          auVar191._8_4_ = fVar183 * auVar174._8_4_;
          auVar191._12_4_ = fVar192 * auVar174._12_4_;
          auVar191._16_4_ = fVar193 * auVar174._16_4_;
          auVar191._20_4_ = fVar194 * auVar174._20_4_;
          auVar191._28_36_ = auVar190._28_36_;
          auVar191._24_4_ = fVar195 * auVar174._24_4_;
          auVar20 = vfmadd231ps_fma(auVar204._0_32_,auVar118,local_580);
          auVar7 = vfmadd231ps_fma(auVar191._0_32_,auVar118,auVar185);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar122,auVar168);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar122,auVar220);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar125,auVar158._0_32_);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar125,local_5a0);
          auVar131 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar104 * 4 + lVar23);
          auVar121 = *(undefined1 (*) [32])(lVar23 + 0x21b5c10 + lVar104 * 4);
          auVar22 = *(undefined1 (*) [32])(lVar23 + 0x21b6094 + lVar104 * 4);
          pfVar1 = (float *)(lVar23 + 0x21b6518 + lVar104 * 4);
          fVar196 = *pfVar1;
          fVar197 = pfVar1[1];
          fVar86 = pfVar1[2];
          fVar87 = pfVar1[3];
          fVar88 = pfVar1[4];
          fVar89 = pfVar1[5];
          fVar90 = pfVar1[6];
          auVar216._0_4_ = fVar196 * auVar177._0_4_;
          auVar216._4_4_ = fVar197 * auVar177._4_4_;
          auVar216._8_4_ = fVar86 * auVar177._8_4_;
          auVar216._12_4_ = fVar87 * auVar177._12_4_;
          auVar216._16_4_ = fVar88 * auVar177._16_4_;
          auVar216._20_4_ = fVar89 * auVar177._20_4_;
          auVar216._28_36_ = auVar177._28_36_;
          auVar216._24_4_ = fVar90 * auVar177._24_4_;
          auVar203._0_4_ = fVar196 * auVar174._0_4_;
          auVar203._4_4_ = fVar197 * auVar174._4_4_;
          auVar203._8_4_ = fVar86 * auVar174._8_4_;
          auVar203._12_4_ = fVar87 * auVar174._12_4_;
          auVar203._16_4_ = fVar88 * auVar174._16_4_;
          auVar203._20_4_ = fVar89 * auVar174._20_4_;
          auVar203._28_36_ = auVar174._28_36_;
          auVar203._24_4_ = fVar90 * auVar174._24_4_;
          auVar8 = vfmadd231ps_fma(auVar216._0_32_,auVar22,local_580);
          auVar9 = vfmadd231ps_fma(auVar203._0_32_,auVar22,auVar185);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar121,auVar168);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar121,auVar220);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar131,auVar158._0_32_);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar131,local_5a0);
          auVar202 = ZEXT1632(auVar20);
          local_640 = vsubps_avx(ZEXT1632(auVar8),auVar202);
          local_480 = ZEXT1632(auVar9);
          auVar187 = ZEXT1632(auVar7);
          local_700 = vsubps_avx(local_480,auVar187);
          auVar85._4_4_ = auVar7._4_4_ * local_640._4_4_;
          auVar85._0_4_ = auVar7._0_4_ * local_640._0_4_;
          auVar85._8_4_ = auVar7._8_4_ * local_640._8_4_;
          auVar85._12_4_ = auVar7._12_4_ * local_640._12_4_;
          auVar85._16_4_ = local_640._16_4_ * 0.0;
          auVar85._20_4_ = local_640._20_4_ * 0.0;
          auVar85._24_4_ = local_640._24_4_ * 0.0;
          auVar85._28_4_ = local_5a0._28_4_;
          fVar198 = local_700._0_4_;
          fVar205 = local_700._4_4_;
          auVar93._4_4_ = auVar20._4_4_ * fVar205;
          auVar93._0_4_ = auVar20._0_4_ * fVar198;
          fVar206 = local_700._8_4_;
          auVar93._8_4_ = auVar20._8_4_ * fVar206;
          fVar207 = local_700._12_4_;
          auVar93._12_4_ = auVar20._12_4_ * fVar207;
          fVar208 = local_700._16_4_;
          auVar93._16_4_ = fVar208 * 0.0;
          fVar209 = local_700._20_4_;
          auVar93._20_4_ = fVar209 * 0.0;
          fVar210 = local_700._24_4_;
          auVar93._24_4_ = fVar210 * 0.0;
          auVar93._28_4_ = auVar21._4_4_;
          auVar19 = vsubps_avx(auVar85,auVar93);
          auVar54._4_4_ = fVar134 * local_100._4_4_;
          auVar54._0_4_ = fVar123 * (float)local_100;
          auVar54._8_4_ = fVar183 * (float)uStack_f8;
          auVar54._12_4_ = fVar192 * uStack_f8._4_4_;
          auVar54._16_4_ = fVar193 * (float)uStack_f0;
          auVar54._20_4_ = fVar194 * uStack_f0._4_4_;
          auVar54._24_4_ = fVar195 * (float)uStack_e8;
          auVar54._28_4_ = local_5a0._28_4_;
          auVar20 = vfmadd231ps_fma(auVar54,local_e0,auVar118);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_c0,auVar122);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar125);
          auVar55._4_4_ = fVar197 * local_100._4_4_;
          auVar55._0_4_ = fVar196 * (float)local_100;
          auVar55._8_4_ = fVar86 * (float)uStack_f8;
          auVar55._12_4_ = fVar87 * uStack_f8._4_4_;
          auVar55._16_4_ = fVar88 * (float)uStack_f0;
          auVar55._20_4_ = fVar89 * uStack_f0._4_4_;
          auVar55._24_4_ = fVar90 * (float)uStack_e8;
          auVar55._28_4_ = uVar105;
          local_5c0 = ZEXT1632(auVar20);
          auVar20 = vfmadd231ps_fma(auVar55,auVar22,local_e0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar121,local_c0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar131,local_a0);
          auVar56._4_4_ = fVar205 * fVar205;
          auVar56._0_4_ = fVar198 * fVar198;
          auVar56._8_4_ = fVar206 * fVar206;
          auVar56._12_4_ = fVar207 * fVar207;
          auVar56._16_4_ = fVar208 * fVar208;
          auVar56._20_4_ = fVar209 * fVar209;
          auVar56._24_4_ = fVar210 * fVar210;
          auVar56._28_4_ = local_a0._28_4_;
          auVar7 = vfmadd231ps_fma(auVar56,local_640,local_640);
          local_5e0 = ZEXT1632(auVar20);
          auVar181 = vmaxps_avx(local_5c0,local_5e0);
          fVar198 = auVar181._0_4_ * auVar181._0_4_;
          fVar205 = auVar181._4_4_ * auVar181._4_4_;
          fVar206 = auVar181._8_4_ * auVar181._8_4_;
          fVar207 = auVar181._12_4_ * auVar181._12_4_;
          fVar208 = auVar181._16_4_ * auVar181._16_4_;
          fVar209 = auVar181._20_4_ * auVar181._20_4_;
          fVar210 = auVar181._24_4_ * auVar181._24_4_;
          auVar203 = ZEXT3264(CONCAT428(auVar181._28_4_,
                                        CONCAT424(fVar210,CONCAT420(fVar209,CONCAT416(fVar208,
                                                  CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(
                                                  fVar205,fVar198))))))));
          auVar188._0_4_ = fVar198 * auVar7._0_4_;
          auVar188._4_4_ = fVar205 * auVar7._4_4_;
          auVar188._8_4_ = fVar206 * auVar7._8_4_;
          auVar188._12_4_ = fVar207 * auVar7._12_4_;
          auVar188._16_4_ = fVar208 * 0.0;
          auVar188._20_4_ = fVar209 * 0.0;
          auVar188._24_4_ = fVar210 * 0.0;
          auVar188._28_4_ = 0;
          auVar57._4_4_ = auVar19._4_4_ * auVar19._4_4_;
          auVar57._0_4_ = auVar19._0_4_ * auVar19._0_4_;
          auVar57._8_4_ = auVar19._8_4_ * auVar19._8_4_;
          auVar57._12_4_ = auVar19._12_4_ * auVar19._12_4_;
          auVar57._16_4_ = auVar19._16_4_ * auVar19._16_4_;
          auVar57._20_4_ = auVar19._20_4_ * auVar19._20_4_;
          auVar57._24_4_ = auVar19._24_4_ * auVar19._24_4_;
          auVar57._28_4_ = auVar19._28_4_;
          auVar181 = vcmpps_avx(auVar57,auVar188,2);
          local_3a0 = (int)lVar104;
          auVar189._4_4_ = local_3a0;
          auVar189._0_4_ = local_3a0;
          auVar189._8_4_ = local_3a0;
          auVar189._12_4_ = local_3a0;
          auVar189._16_4_ = local_3a0;
          auVar189._20_4_ = local_3a0;
          auVar189._24_4_ = local_3a0;
          auVar189._28_4_ = local_3a0;
          auVar19 = vpor_avx2(auVar189,_DAT_01fe9900);
          auVar120 = vpcmpgtd_avx2(local_4c0,auVar19);
          auVar19 = auVar120 & auVar181;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0x7f,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar19 >> 0xbf,0) == '\0') &&
              (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar19[0x1f]) {
            auVar190 = ZEXT3264(auVar186);
            auVar216 = ZEXT3264(auVar144);
LAB_0190c8a2:
            auVar174 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar135,CONCAT420(fVar152,CONCAT416(
                                                  fVar135,CONCAT412(fVar152,CONCAT48(fVar135,uVar106
                                                                                    )))))));
            auVar177 = ZEXT3264(CONCAT428(fVar213,CONCAT424(fVar213,CONCAT420(fVar213,CONCAT416(
                                                  fVar213,CONCAT412(fVar213,CONCAT48(fVar213,
                                                  CONCAT44(fVar213,fVar213))))))));
          }
          else {
            local_4e0 = vandps_avx(auVar120,auVar181);
            auVar58._4_4_ = fVar197 * local_140._4_4_;
            auVar58._0_4_ = fVar196 * (float)local_140;
            auVar58._8_4_ = fVar86 * (float)uStack_138;
            auVar58._12_4_ = fVar87 * uStack_138._4_4_;
            auVar58._16_4_ = fVar88 * (float)uStack_130;
            auVar58._20_4_ = fVar89 * uStack_130._4_4_;
            auVar58._24_4_ = fVar90 * (float)uStack_128;
            auVar58._28_4_ = auVar181._28_4_;
            auVar20 = vfmadd213ps_fma(auVar22,local_560,auVar58);
            auVar20 = vfmadd213ps_fma(auVar121,local_120,ZEXT1632(auVar20));
            auVar20 = vfmadd132ps_fma(auVar131,ZEXT1632(auVar20),local_620);
            local_600 = ZEXT1632(auVar20);
            local_4a0._0_4_ = auVar92._0_4_;
            local_4a0._4_4_ = auVar92._4_4_;
            fStack_498 = auVar92._8_4_;
            fStack_494 = auVar92._12_4_;
            fStack_490 = auVar92._16_4_;
            fStack_48c = auVar92._20_4_;
            fStack_488 = auVar92._24_4_;
            auVar59._4_4_ = local_140._4_4_ * (float)local_4a0._4_4_;
            auVar59._0_4_ = (float)local_140 * (float)local_4a0._0_4_;
            auVar59._8_4_ = (float)uStack_138 * fStack_498;
            auVar59._12_4_ = uStack_138._4_4_ * fStack_494;
            auVar59._16_4_ = (float)uStack_130 * fStack_490;
            auVar59._20_4_ = uStack_130._4_4_ * fStack_48c;
            auVar59._24_4_ = (float)uStack_128 * fStack_488;
            auVar59._28_4_ = auVar181._28_4_;
            auVar20 = vfmadd213ps_fma(auVar118,local_560,auVar59);
            auVar20 = vfmadd213ps_fma(auVar122,local_120,ZEXT1632(auVar20));
            auVar122 = *(undefined1 (*) [32])(lVar23 + 0x21b457c + lVar104 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar23 + 0x21b4a00 + lVar104 * 4);
            auVar131 = *(undefined1 (*) [32])(lVar23 + 0x21b4e84 + lVar104 * 4);
            pfVar3 = (float *)(lVar23 + 0x21b5308 + lVar104 * 4);
            fVar198 = *pfVar3;
            fVar205 = pfVar3[1];
            fVar206 = pfVar3[2];
            fVar207 = pfVar3[3];
            fVar208 = pfVar3[4];
            fVar209 = pfVar3[5];
            fVar210 = pfVar3[6];
            auVar60._4_4_ = fVar213 * fVar205;
            auVar60._0_4_ = fVar213 * fVar198;
            auVar60._8_4_ = fVar213 * fVar206;
            auVar60._12_4_ = fVar213 * fVar207;
            auVar60._16_4_ = fVar213 * fVar208;
            auVar60._20_4_ = fVar213 * fVar209;
            auVar60._24_4_ = fVar213 * fVar210;
            auVar60._28_4_ = pfVar1[7];
            auVar61._4_4_ = fVar152 * fVar205;
            auVar61._0_4_ = fVar135 * fVar198;
            auVar61._8_4_ = fVar135 * fVar206;
            auVar61._12_4_ = fVar152 * fVar207;
            auVar61._16_4_ = fVar135 * fVar208;
            auVar61._20_4_ = fVar152 * fVar209;
            auVar61._24_4_ = fVar135 * fVar210;
            auVar61._28_4_ = auVar121._28_4_;
            auVar62._4_4_ = fVar205 * local_140._4_4_;
            auVar62._0_4_ = fVar198 * (float)local_140;
            auVar62._8_4_ = fVar206 * (float)uStack_138;
            auVar62._12_4_ = fVar207 * uStack_138._4_4_;
            auVar62._16_4_ = fVar208 * (float)uStack_130;
            auVar62._20_4_ = fVar209 * uStack_130._4_4_;
            auVar62._24_4_ = fVar210 * (float)uStack_128;
            auVar62._28_4_ = pfVar3[7];
            auVar7 = vfmadd231ps_fma(auVar60,auVar131,local_580);
            auVar9 = vfmadd231ps_fma(auVar61,auVar131,auVar185);
            auVar13 = vfmadd231ps_fma(auVar62,local_560,auVar131);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar118,auVar168);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar118,auVar220);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_120,auVar118);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar122,local_740);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar122,local_5a0);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar122,local_620);
            pfVar1 = (float *)(lVar23 + 0x21b7728 + lVar104 * 4);
            fVar198 = *pfVar1;
            fVar205 = pfVar1[1];
            fVar206 = pfVar1[2];
            fVar207 = pfVar1[3];
            fVar208 = pfVar1[4];
            fVar209 = pfVar1[5];
            fVar210 = pfVar1[6];
            auVar63._4_4_ = fVar213 * fVar205;
            auVar63._0_4_ = fVar213 * fVar198;
            auVar63._8_4_ = fVar213 * fVar206;
            auVar63._12_4_ = fVar213 * fVar207;
            auVar63._16_4_ = fVar213 * fVar208;
            auVar63._20_4_ = fVar213 * fVar209;
            auVar63._24_4_ = fVar213 * fVar210;
            auVar63._28_4_ = fVar213;
            auVar64._4_4_ = fVar152 * fVar205;
            auVar64._0_4_ = fVar135 * fVar198;
            auVar64._8_4_ = fVar135 * fVar206;
            auVar64._12_4_ = fVar152 * fVar207;
            auVar64._16_4_ = fVar135 * fVar208;
            auVar64._20_4_ = fVar152 * fVar209;
            auVar64._24_4_ = fVar135 * fVar210;
            auVar64._28_4_ = fVar152;
            auVar65._4_4_ = local_140._4_4_ * fVar205;
            auVar65._0_4_ = (float)local_140 * fVar198;
            auVar65._8_4_ = (float)uStack_138 * fVar206;
            auVar65._12_4_ = uStack_138._4_4_ * fVar207;
            auVar65._16_4_ = (float)uStack_130 * fVar208;
            auVar65._20_4_ = uStack_130._4_4_ * fVar209;
            auVar65._24_4_ = (float)uStack_128 * fVar210;
            auVar65._28_4_ = pfVar1[7];
            auVar122 = *(undefined1 (*) [32])(lVar23 + 0x21b72a4 + lVar104 * 4);
            auVar107 = vfmadd231ps_fma(auVar63,auVar122,local_580);
            auVar136 = vfmadd231ps_fma(auVar64,auVar122,auVar185);
            auVar108 = vfmadd231ps_fma(auVar65,local_560,auVar122);
            auVar122 = *(undefined1 (*) [32])(lVar23 + 0x21b6e20 + lVar104 * 4);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar122,auVar168);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar122,auVar220);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_120,auVar122);
            auVar122 = *(undefined1 (*) [32])(lVar23 + 0x21b699c + lVar104 * 4);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar122,local_740);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar122,local_5a0);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_620,auVar122);
            auVar122 = vandps_avx(ZEXT1632(auVar7),local_420);
            auVar118 = vandps_avx(ZEXT1632(auVar9),local_420);
            auVar118 = vmaxps_avx(auVar122,auVar118);
            auVar122 = vandps_avx(ZEXT1632(auVar13),local_420);
            auVar122 = vmaxps_avx(auVar118,auVar122);
            auVar91._4_4_ = fStack_71c;
            auVar91._0_4_ = local_720;
            auVar91._8_4_ = fStack_718;
            auVar91._12_4_ = fStack_714;
            auVar91._16_4_ = fStack_710;
            auVar91._20_4_ = fStack_70c;
            auVar91._24_4_ = fStack_708;
            auVar91._28_4_ = fStack_704;
            auVar122 = vcmpps_avx(auVar122,auVar91,1);
            auVar131 = vblendvps_avx(ZEXT1632(auVar7),local_640,auVar122);
            auVar121 = vblendvps_avx(ZEXT1632(auVar9),local_700,auVar122);
            auVar122 = vandps_avx(ZEXT1632(auVar107),local_420);
            auVar118 = vandps_avx(ZEXT1632(auVar136),local_420);
            auVar118 = vmaxps_avx(auVar122,auVar118);
            auVar122 = vandps_avx(local_420,ZEXT1632(auVar108));
            auVar122 = vmaxps_avx(auVar118,auVar122);
            auVar118 = vcmpps_avx(auVar122,auVar91,1);
            auVar122 = vblendvps_avx(ZEXT1632(auVar107),local_640,auVar118);
            auVar118 = vblendvps_avx(ZEXT1632(auVar136),local_700,auVar118);
            auVar20 = vfmadd213ps_fma(auVar125,local_620,ZEXT1632(auVar20));
            auVar7 = vfmadd213ps_fma(auVar131,auVar131,ZEXT832(0) << 0x20);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar121,auVar121);
            auVar125 = vrsqrtps_avx(ZEXT1632(auVar7));
            fVar198 = auVar125._0_4_;
            fVar205 = auVar125._4_4_;
            fVar206 = auVar125._8_4_;
            fVar207 = auVar125._12_4_;
            fVar208 = auVar125._16_4_;
            fVar209 = auVar125._20_4_;
            fVar210 = auVar125._24_4_;
            auVar66._4_4_ = fVar205 * fVar205 * fVar205 * auVar7._4_4_ * -0.5;
            auVar66._0_4_ = fVar198 * fVar198 * fVar198 * auVar7._0_4_ * -0.5;
            auVar66._8_4_ = fVar206 * fVar206 * fVar206 * auVar7._8_4_ * -0.5;
            auVar66._12_4_ = fVar207 * fVar207 * fVar207 * auVar7._12_4_ * -0.5;
            auVar66._16_4_ = fVar208 * fVar208 * fVar208 * -0.0;
            auVar66._20_4_ = fVar209 * fVar209 * fVar209 * -0.0;
            auVar66._24_4_ = fVar210 * fVar210 * fVar210 * -0.0;
            auVar66._28_4_ = 0;
            auVar167._8_4_ = 0x3fc00000;
            auVar167._0_8_ = 0x3fc000003fc00000;
            auVar167._12_4_ = 0x3fc00000;
            auVar167._16_4_ = 0x3fc00000;
            auVar167._20_4_ = 0x3fc00000;
            auVar167._24_4_ = 0x3fc00000;
            auVar167._28_4_ = 0x3fc00000;
            auVar7 = vfmadd231ps_fma(auVar66,auVar167,auVar125);
            fVar198 = auVar7._0_4_;
            fVar205 = auVar7._4_4_;
            auVar67._4_4_ = auVar121._4_4_ * fVar205;
            auVar67._0_4_ = auVar121._0_4_ * fVar198;
            fVar206 = auVar7._8_4_;
            auVar67._8_4_ = auVar121._8_4_ * fVar206;
            fVar207 = auVar7._12_4_;
            auVar67._12_4_ = auVar121._12_4_ * fVar207;
            auVar67._16_4_ = auVar121._16_4_ * 0.0;
            auVar67._20_4_ = auVar121._20_4_ * 0.0;
            auVar67._24_4_ = auVar121._24_4_ * 0.0;
            auVar67._28_4_ = auVar121._28_4_;
            auVar68._4_4_ = fVar205 * -auVar131._4_4_;
            auVar68._0_4_ = fVar198 * -auVar131._0_4_;
            auVar68._8_4_ = fVar206 * -auVar131._8_4_;
            auVar68._12_4_ = fVar207 * -auVar131._12_4_;
            auVar68._16_4_ = -auVar131._16_4_ * 0.0;
            auVar68._20_4_ = -auVar131._20_4_ * 0.0;
            auVar68._24_4_ = -auVar131._24_4_ * 0.0;
            auVar68._28_4_ = auVar125._28_4_;
            auVar7 = vfmadd213ps_fma(auVar122,auVar122,ZEXT832(0) << 0x20);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar118,auVar118);
            auVar125 = vrsqrtps_avx(ZEXT1632(auVar7));
            auVar69._28_4_ = local_640._28_4_;
            auVar69._0_28_ =
                 ZEXT1628(CONCAT412(fVar207 * 0.0,
                                    CONCAT48(fVar206 * 0.0,CONCAT44(fVar205 * 0.0,fVar198 * 0.0))));
            fVar198 = auVar125._0_4_;
            fVar205 = auVar125._4_4_;
            fVar206 = auVar125._8_4_;
            fVar207 = auVar125._12_4_;
            fVar208 = auVar125._16_4_;
            fVar209 = auVar125._20_4_;
            fVar210 = auVar125._24_4_;
            auVar70._4_4_ = fVar205 * fVar205 * fVar205 * auVar7._4_4_ * -0.5;
            auVar70._0_4_ = fVar198 * fVar198 * fVar198 * auVar7._0_4_ * -0.5;
            auVar70._8_4_ = fVar206 * fVar206 * fVar206 * auVar7._8_4_ * -0.5;
            auVar70._12_4_ = fVar207 * fVar207 * fVar207 * auVar7._12_4_ * -0.5;
            auVar70._16_4_ = fVar208 * fVar208 * fVar208 * -0.0;
            auVar70._20_4_ = fVar209 * fVar209 * fVar209 * -0.0;
            auVar70._24_4_ = fVar210 * fVar210 * fVar210 * -0.0;
            auVar70._28_4_ = 0;
            auVar7 = vfmadd231ps_fma(auVar70,auVar167,auVar125);
            fVar198 = auVar7._0_4_;
            fVar205 = auVar7._4_4_;
            auVar71._4_4_ = auVar118._4_4_ * fVar205;
            auVar71._0_4_ = auVar118._0_4_ * fVar198;
            fVar206 = auVar7._8_4_;
            auVar71._8_4_ = auVar118._8_4_ * fVar206;
            fVar207 = auVar7._12_4_;
            auVar71._12_4_ = auVar118._12_4_ * fVar207;
            auVar71._16_4_ = auVar118._16_4_ * 0.0;
            auVar71._20_4_ = auVar118._20_4_ * 0.0;
            auVar71._24_4_ = auVar118._24_4_ * 0.0;
            auVar71._28_4_ = 0;
            auVar72._4_4_ = fVar205 * -auVar122._4_4_;
            auVar72._0_4_ = fVar198 * -auVar122._0_4_;
            auVar72._8_4_ = fVar206 * -auVar122._8_4_;
            auVar72._12_4_ = fVar207 * -auVar122._12_4_;
            auVar72._16_4_ = -auVar122._16_4_ * 0.0;
            auVar72._20_4_ = -auVar122._20_4_ * 0.0;
            auVar72._24_4_ = -auVar122._24_4_ * 0.0;
            auVar72._28_4_ = 0;
            auVar73._28_4_ = 0xbf000000;
            auVar73._0_28_ =
                 ZEXT1628(CONCAT412(fVar207 * 0.0,
                                    CONCAT48(fVar206 * 0.0,CONCAT44(fVar205 * 0.0,fVar198 * 0.0))));
            auVar7 = vfmadd213ps_fma(auVar67,local_5c0,auVar202);
            auVar9 = vfmadd213ps_fma(auVar68,local_5c0,auVar187);
            auVar13 = vfmadd213ps_fma(auVar69,local_5c0,ZEXT1632(auVar20));
            auVar24 = vfnmadd213ps_fma(auVar67,local_5c0,auVar202);
            auVar107 = vfmadd213ps_fma(auVar71,local_5e0,ZEXT1632(auVar8));
            auVar137 = vfnmadd213ps_fma(auVar68,local_5c0,auVar187);
            auVar136 = vfmadd213ps_fma(auVar72,local_5e0,local_480);
            auVar20 = vfnmadd231ps_fma(ZEXT1632(auVar20),local_5c0,auVar69);
            auVar108 = vfmadd213ps_fma(auVar73,local_5e0,local_600);
            auVar138 = vfnmadd213ps_fma(auVar71,local_5e0,ZEXT1632(auVar8));
            auVar153 = vfnmadd213ps_fma(auVar72,local_5e0,local_480);
            auVar154 = vfnmadd231ps_fma(local_600,local_5e0,auVar73);
            auVar125 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar137));
            auVar122 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar20));
            auVar74._4_4_ = auVar125._4_4_ * auVar20._4_4_;
            auVar74._0_4_ = auVar125._0_4_ * auVar20._0_4_;
            auVar74._8_4_ = auVar125._8_4_ * auVar20._8_4_;
            auVar74._12_4_ = auVar125._12_4_ * auVar20._12_4_;
            auVar74._16_4_ = auVar125._16_4_ * 0.0;
            auVar74._20_4_ = auVar125._20_4_ * 0.0;
            auVar74._24_4_ = auVar125._24_4_ * 0.0;
            auVar74._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar74,ZEXT1632(auVar137),auVar122);
            auVar75._4_4_ = auVar24._4_4_ * auVar122._4_4_;
            auVar75._0_4_ = auVar24._0_4_ * auVar122._0_4_;
            auVar75._8_4_ = auVar24._8_4_ * auVar122._8_4_;
            auVar75._12_4_ = auVar24._12_4_ * auVar122._12_4_;
            auVar75._16_4_ = auVar122._16_4_ * 0.0;
            auVar75._20_4_ = auVar122._20_4_ * 0.0;
            auVar75._24_4_ = auVar122._24_4_ * 0.0;
            auVar75._28_4_ = auVar122._28_4_;
            auVar181 = ZEXT1632(auVar24);
            auVar122 = vsubps_avx(ZEXT1632(auVar107),auVar181);
            auVar120 = ZEXT1632(auVar20);
            auVar20 = vfmsub231ps_fma(auVar75,auVar120,auVar122);
            auVar76._4_4_ = auVar137._4_4_ * auVar122._4_4_;
            auVar76._0_4_ = auVar137._0_4_ * auVar122._0_4_;
            auVar76._8_4_ = auVar137._8_4_ * auVar122._8_4_;
            auVar76._12_4_ = auVar137._12_4_ * auVar122._12_4_;
            auVar76._16_4_ = auVar122._16_4_ * 0.0;
            auVar76._20_4_ = auVar122._20_4_ * 0.0;
            auVar76._24_4_ = auVar122._24_4_ * 0.0;
            auVar76._28_4_ = auVar122._28_4_;
            auVar24 = vfmsub231ps_fma(auVar76,auVar181,auVar125);
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar187 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
            auVar125 = vblendvps_avx(ZEXT1632(auVar138),ZEXT1632(auVar7),auVar187);
            auVar122 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar9),auVar187);
            auVar118 = vblendvps_avx(ZEXT1632(auVar154),ZEXT1632(auVar13),auVar187);
            auVar131 = vblendvps_avx(auVar181,ZEXT1632(auVar107),auVar187);
            auVar121 = vblendvps_avx(ZEXT1632(auVar137),ZEXT1632(auVar136),auVar187);
            auVar22 = vblendvps_avx(auVar120,ZEXT1632(auVar108),auVar187);
            auVar181 = vblendvps_avx(ZEXT1632(auVar107),auVar181,auVar187);
            auVar19 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar137),auVar187);
            auVar20 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
            auVar120 = vblendvps_avx(ZEXT1632(auVar108),auVar120,auVar187);
            auVar181 = vsubps_avx(auVar181,auVar125);
            auVar19 = vsubps_avx(auVar19,auVar122);
            auVar202 = vsubps_avx(auVar120,auVar118);
            auVar145 = vsubps_avx(auVar125,auVar131);
            auVar203 = ZEXT3264(auVar145);
            auVar155 = vsubps_avx(auVar122,auVar121);
            auVar165 = vsubps_avx(auVar118,auVar22);
            auVar170._0_4_ = auVar202._0_4_ * auVar125._0_4_;
            auVar170._4_4_ = auVar202._4_4_ * auVar125._4_4_;
            auVar170._8_4_ = auVar202._8_4_ * auVar125._8_4_;
            auVar170._12_4_ = auVar202._12_4_ * auVar125._12_4_;
            auVar170._16_4_ = auVar202._16_4_ * auVar125._16_4_;
            auVar170._20_4_ = auVar202._20_4_ * auVar125._20_4_;
            auVar170._24_4_ = auVar202._24_4_ * auVar125._24_4_;
            auVar170._28_4_ = 0;
            auVar7 = vfmsub231ps_fma(auVar170,auVar118,auVar181);
            auVar77._4_4_ = auVar181._4_4_ * auVar122._4_4_;
            auVar77._0_4_ = auVar181._0_4_ * auVar122._0_4_;
            auVar77._8_4_ = auVar181._8_4_ * auVar122._8_4_;
            auVar77._12_4_ = auVar181._12_4_ * auVar122._12_4_;
            auVar77._16_4_ = auVar181._16_4_ * auVar122._16_4_;
            auVar77._20_4_ = auVar181._20_4_ * auVar122._20_4_;
            auVar77._24_4_ = auVar181._24_4_ * auVar122._24_4_;
            auVar77._28_4_ = auVar120._28_4_;
            auVar8 = vfmsub231ps_fma(auVar77,auVar125,auVar19);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
            auVar171._0_4_ = auVar19._0_4_ * auVar118._0_4_;
            auVar171._4_4_ = auVar19._4_4_ * auVar118._4_4_;
            auVar171._8_4_ = auVar19._8_4_ * auVar118._8_4_;
            auVar171._12_4_ = auVar19._12_4_ * auVar118._12_4_;
            auVar171._16_4_ = auVar19._16_4_ * auVar118._16_4_;
            auVar171._20_4_ = auVar19._20_4_ * auVar118._20_4_;
            auVar171._24_4_ = auVar19._24_4_ * auVar118._24_4_;
            auVar171._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar171,auVar122,auVar202);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar172._0_4_ = auVar165._0_4_ * auVar131._0_4_;
            auVar172._4_4_ = auVar165._4_4_ * auVar131._4_4_;
            auVar172._8_4_ = auVar165._8_4_ * auVar131._8_4_;
            auVar172._12_4_ = auVar165._12_4_ * auVar131._12_4_;
            auVar172._16_4_ = auVar165._16_4_ * auVar131._16_4_;
            auVar172._20_4_ = auVar165._20_4_ * auVar131._20_4_;
            auVar172._24_4_ = auVar165._24_4_ * auVar131._24_4_;
            auVar172._28_4_ = 0;
            auVar7 = vfmsub231ps_fma(auVar172,auVar145,auVar22);
            auVar78._4_4_ = auVar155._4_4_ * auVar22._4_4_;
            auVar78._0_4_ = auVar155._0_4_ * auVar22._0_4_;
            auVar78._8_4_ = auVar155._8_4_ * auVar22._8_4_;
            auVar78._12_4_ = auVar155._12_4_ * auVar22._12_4_;
            auVar78._16_4_ = auVar155._16_4_ * auVar22._16_4_;
            auVar78._20_4_ = auVar155._20_4_ * auVar22._20_4_;
            auVar78._24_4_ = auVar155._24_4_ * auVar22._24_4_;
            auVar78._28_4_ = auVar125._28_4_;
            auVar9 = vfmsub231ps_fma(auVar78,auVar121,auVar165);
            auVar79._4_4_ = auVar145._4_4_ * auVar121._4_4_;
            auVar79._0_4_ = auVar145._0_4_ * auVar121._0_4_;
            auVar79._8_4_ = auVar145._8_4_ * auVar121._8_4_;
            auVar79._12_4_ = auVar145._12_4_ * auVar121._12_4_;
            auVar79._16_4_ = auVar145._16_4_ * auVar121._16_4_;
            auVar79._20_4_ = auVar145._20_4_ * auVar121._20_4_;
            auVar79._24_4_ = auVar145._24_4_ * auVar121._24_4_;
            auVar79._28_4_ = auVar121._28_4_;
            auVar13 = vfmsub231ps_fma(auVar79,auVar155,auVar131);
            auVar121 = ZEXT832(0) << 0x20;
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,ZEXT1632(auVar7));
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar121,ZEXT1632(auVar9));
            auVar131 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
            auVar131 = vcmpps_avx(auVar131,auVar121,2);
            auVar7 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
            auVar7 = vpand_avx(auVar7,auVar20);
            auVar131 = vpmovsxwd_avx2(auVar7);
            if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar131 >> 0x7f,0) == '\0') &&
                  (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar131 >> 0xbf,0) == '\0') &&
                (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar131[0x1f]) {
LAB_0190ce0f:
              auVar157._8_8_ = uStack_658;
              auVar157._0_8_ = local_660;
              auVar157._16_8_ = uStack_650;
              auVar157._24_8_ = uStack_648;
              auVar190 = ZEXT3264(auVar186);
              auVar216 = ZEXT3264(auVar144);
            }
            else {
              auVar80._4_4_ = auVar19._4_4_ * auVar165._4_4_;
              auVar80._0_4_ = auVar19._0_4_ * auVar165._0_4_;
              auVar80._8_4_ = auVar19._8_4_ * auVar165._8_4_;
              auVar80._12_4_ = auVar19._12_4_ * auVar165._12_4_;
              auVar80._16_4_ = auVar19._16_4_ * auVar165._16_4_;
              auVar80._20_4_ = auVar19._20_4_ * auVar165._20_4_;
              auVar80._24_4_ = auVar19._24_4_ * auVar165._24_4_;
              auVar80._28_4_ = auVar131._28_4_;
              auVar108 = vfmsub231ps_fma(auVar80,auVar155,auVar202);
              auVar173._0_4_ = auVar202._0_4_ * auVar145._0_4_;
              auVar173._4_4_ = auVar202._4_4_ * auVar145._4_4_;
              auVar173._8_4_ = auVar202._8_4_ * auVar145._8_4_;
              auVar173._12_4_ = auVar202._12_4_ * auVar145._12_4_;
              auVar173._16_4_ = auVar202._16_4_ * auVar145._16_4_;
              auVar173._20_4_ = auVar202._20_4_ * auVar145._20_4_;
              auVar173._24_4_ = auVar202._24_4_ * auVar145._24_4_;
              auVar173._28_4_ = 0;
              auVar136 = vfmsub231ps_fma(auVar173,auVar181,auVar165);
              auVar81._4_4_ = auVar181._4_4_ * auVar155._4_4_;
              auVar81._0_4_ = auVar181._0_4_ * auVar155._0_4_;
              auVar81._8_4_ = auVar181._8_4_ * auVar155._8_4_;
              auVar81._12_4_ = auVar181._12_4_ * auVar155._12_4_;
              auVar81._16_4_ = auVar181._16_4_ * auVar155._16_4_;
              auVar81._20_4_ = auVar181._20_4_ * auVar155._20_4_;
              auVar81._24_4_ = auVar181._24_4_ * auVar155._24_4_;
              auVar81._28_4_ = auVar155._28_4_;
              auVar24 = vfmsub231ps_fma(auVar81,auVar145,auVar19);
              auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar136),ZEXT1632(auVar24));
              auVar107 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar108),auVar121);
              auVar131 = vrcpps_avx(ZEXT1632(auVar107));
              auVar203 = ZEXT3264(auVar131);
              auVar215._8_4_ = 0x3f800000;
              auVar215._0_8_ = 0x3f8000003f800000;
              auVar215._12_4_ = 0x3f800000;
              auVar215._16_4_ = 0x3f800000;
              auVar215._20_4_ = 0x3f800000;
              auVar215._24_4_ = 0x3f800000;
              auVar215._28_4_ = 0x3f800000;
              auVar13 = vfnmadd213ps_fma(auVar131,ZEXT1632(auVar107),auVar215);
              auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar131,auVar131);
              auVar82._4_4_ = auVar24._4_4_ * auVar118._4_4_;
              auVar82._0_4_ = auVar24._0_4_ * auVar118._0_4_;
              auVar82._8_4_ = auVar24._8_4_ * auVar118._8_4_;
              auVar82._12_4_ = auVar24._12_4_ * auVar118._12_4_;
              auVar82._16_4_ = auVar118._16_4_ * 0.0;
              auVar82._20_4_ = auVar118._20_4_ * 0.0;
              auVar82._24_4_ = auVar118._24_4_ * 0.0;
              auVar82._28_4_ = auVar122._28_4_;
              auVar136 = vfmadd231ps_fma(auVar82,ZEXT1632(auVar136),auVar122);
              auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),ZEXT1632(auVar108),auVar125);
              fVar198 = auVar13._0_4_;
              fVar205 = auVar13._4_4_;
              fVar206 = auVar13._8_4_;
              fVar207 = auVar13._12_4_;
              auVar118 = ZEXT1632(CONCAT412(fVar207 * auVar136._12_4_,
                                            CONCAT48(fVar206 * auVar136._8_4_,
                                                     CONCAT44(fVar205 * auVar136._4_4_,
                                                              fVar198 * auVar136._0_4_))));
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar156._4_4_ = uVar4;
              auVar156._0_4_ = uVar4;
              auVar156._8_4_ = uVar4;
              auVar156._12_4_ = uVar4;
              auVar156._16_4_ = uVar4;
              auVar156._20_4_ = uVar4;
              auVar156._24_4_ = uVar4;
              auVar156._28_4_ = uVar4;
              auVar125 = vcmpps_avx(local_500,auVar118,2);
              auVar122 = vcmpps_avx(auVar118,auVar156,2);
              auVar125 = vandps_avx(auVar122,auVar125);
              auVar13 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
              auVar7 = vpand_avx(auVar7,auVar13);
              auVar125 = vpmovsxwd_avx2(auVar7);
              if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar125 >> 0x7f,0) == '\0') &&
                    (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar125 >> 0xbf,0) == '\0') &&
                  (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar125[0x1f]) goto LAB_0190ce0f;
              auVar125 = vcmpps_avx(ZEXT1632(auVar107),ZEXT832(0) << 0x20,4);
              auVar13 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
              auVar7 = vpand_avx(auVar7,auVar13);
              auVar125 = vpmovsxwd_avx2(auVar7);
              auVar157._8_8_ = uStack_658;
              auVar157._0_8_ = local_660;
              auVar157._16_8_ = uStack_650;
              auVar157._24_8_ = uStack_648;
              auVar190 = ZEXT3264(auVar186);
              auVar216 = ZEXT3264(auVar144);
              if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar125 >> 0x7f,0) != '\0') ||
                    (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar125 >> 0xbf,0) != '\0') ||
                  (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar125[0x1f] < '\0') {
                auVar131 = ZEXT1632(CONCAT412(fVar207 * auVar8._12_4_,
                                              CONCAT48(fVar206 * auVar8._8_4_,
                                                       CONCAT44(fVar205 * auVar8._4_4_,
                                                                fVar198 * auVar8._0_4_))));
                auVar83._28_4_ = SUB84(uStack_648,4);
                auVar83._0_28_ =
                     ZEXT1628(CONCAT412(fVar207 * auVar9._12_4_,
                                        CONCAT48(fVar206 * auVar9._8_4_,
                                                 CONCAT44(fVar205 * auVar9._4_4_,
                                                          fVar198 * auVar9._0_4_))));
                auVar182._8_4_ = 0x3f800000;
                auVar182._0_8_ = 0x3f8000003f800000;
                auVar182._12_4_ = 0x3f800000;
                auVar182._16_4_ = 0x3f800000;
                auVar182._20_4_ = 0x3f800000;
                auVar182._24_4_ = 0x3f800000;
                auVar182._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx(auVar182,auVar131);
                auVar122 = vblendvps_avx(auVar122,auVar131,auVar187);
                auVar190 = ZEXT3264(auVar122);
                auVar122 = vsubps_avx(auVar182,auVar83);
                local_540 = vblendvps_avx(auVar122,auVar83,auVar187);
                auVar216 = ZEXT3264(auVar118);
                auVar157 = auVar125;
              }
            }
            if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar157 >> 0x7f,0) == '\0') &&
                  (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar157 >> 0xbf,0) == '\0') &&
                (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar157[0x1f]) goto LAB_0190c8a2;
            auVar125 = vsubps_avx(local_5e0,local_5c0);
            local_760 = auVar190._0_32_;
            auVar7 = vfmadd213ps_fma(auVar125,local_760,local_5c0);
            fVar198 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar84._4_4_ = (auVar7._4_4_ + auVar7._4_4_) * fVar198;
            auVar84._0_4_ = (auVar7._0_4_ + auVar7._0_4_) * fVar198;
            auVar84._8_4_ = (auVar7._8_4_ + auVar7._8_4_) * fVar198;
            auVar84._12_4_ = (auVar7._12_4_ + auVar7._12_4_) * fVar198;
            auVar84._16_4_ = fVar198 * 0.0;
            auVar84._20_4_ = fVar198 * 0.0;
            auVar84._24_4_ = fVar198 * 0.0;
            auVar84._28_4_ = fVar198;
            auVar118 = auVar216._0_32_;
            auVar125 = vcmpps_avx(auVar118,auVar84,6);
            auVar122 = auVar157 & auVar125;
            auVar174 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar135,CONCAT420(fVar152,CONCAT416(
                                                  fVar135,CONCAT412(fVar152,CONCAT48(fVar135,uVar106
                                                                                    )))))));
            auVar177 = ZEXT3264(CONCAT428(fVar213,CONCAT424(fVar213,CONCAT420(fVar213,CONCAT416(
                                                  fVar213,CONCAT412(fVar213,CONCAT48(fVar213,
                                                  CONCAT44(fVar213,fVar213))))))));
            if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar122 >> 0x7f,0) != '\0') ||
                  (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0xbf,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar122[0x1f] < '\0') {
              auVar133._8_4_ = 0xbf800000;
              auVar133._0_8_ = 0xbf800000bf800000;
              auVar133._12_4_ = 0xbf800000;
              auVar133._16_4_ = 0xbf800000;
              auVar133._20_4_ = 0xbf800000;
              auVar133._24_4_ = 0xbf800000;
              auVar133._28_4_ = 0xbf800000;
              auVar150._8_4_ = 0x40000000;
              auVar150._0_8_ = 0x4000000040000000;
              auVar150._12_4_ = 0x40000000;
              auVar150._16_4_ = 0x40000000;
              auVar150._20_4_ = 0x40000000;
              auVar150._24_4_ = 0x40000000;
              auVar150._28_4_ = 0x40000000;
              auVar7 = vfmadd213ps_fma(local_540,auVar150,auVar133);
              local_3e0 = ZEXT1632(auVar7);
              local_390 = local_7b0;
              uStack_388 = uStack_7a8;
              local_380 = local_7c0;
              uStack_378 = uStack_7b8;
              local_370 = local_7d0;
              uStack_368 = uStack_7c8;
              pGVar15 = (context->scene->geometries).items[(uint)local_8a0._4_4_].ptr;
              local_540 = local_3e0;
              if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                bVar95 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar95 = 1, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar125 = vandps_avx(auVar125,auVar157);
                fVar198 = (float)local_3a0;
                local_320[0] = (fVar198 + auVar190._0_4_ + 0.0) * local_1a0;
                local_320[1] = (fVar198 + auVar190._4_4_ + 1.0) * fStack_19c;
                local_320[2] = (fVar198 + auVar190._8_4_ + 2.0) * fStack_198;
                local_320[3] = (fVar198 + auVar190._12_4_ + 3.0) * fStack_194;
                fStack_310 = (fVar198 + auVar190._16_4_ + 4.0) * fStack_190;
                fStack_30c = (fVar198 + auVar190._20_4_ + 5.0) * fStack_18c;
                fStack_308 = (fVar198 + auVar190._24_4_ + 6.0) * fStack_188;
                fStack_304 = fVar198 + auVar190._28_4_ + 7.0;
                local_540._0_8_ = auVar7._0_8_;
                local_540._8_8_ = auVar7._8_8_;
                local_300 = local_540._0_8_;
                uStack_2f8 = local_540._8_8_;
                uStack_2f0 = 0;
                uStack_2e8 = 0;
                local_2e0 = auVar118;
                uVar99 = vmovmskps_avx(auVar125);
                if (uVar99 == 0) {
                  bVar95 = 0;
LAB_0190ce3b:
                  auVar190 = ZEXT3264(local_760);
                  auVar216 = ZEXT3264(auVar118);
                  auVar174 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar135,CONCAT420(fVar152,
                                                  CONCAT416(fVar135,CONCAT412(fVar152,CONCAT48(
                                                  fVar135,uVar106)))))));
                  auVar177 = ZEXT3264(CONCAT428(fVar213,CONCAT424(fVar213,CONCAT420(fVar213,
                                                  CONCAT416(fVar213,CONCAT412(fVar213,CONCAT48(
                                                  fVar213,CONCAT44(fVar213,fVar213))))))));
                }
                else {
                  lVar17 = 0;
                  local_940 = (ulong)(uVar99 & 0xff);
                  for (uVar98 = local_940; (uVar98 & 1) == 0;
                      uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                    lVar17 = lVar17 + 1;
                  }
                  local_960 = ZEXT1632(CONCAT88(auVar20._8_8_,lVar17));
                  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
                  _local_4a0 = *pauVar2;
                  local_400 = local_760;
                  local_3c0 = auVar118;
                  local_39c = iVar97;
                  do {
                    fVar198 = local_320[local_960._0_8_];
                    auVar110._4_4_ = fVar198;
                    auVar110._0_4_ = fVar198;
                    auVar110._8_4_ = fVar198;
                    auVar110._12_4_ = fVar198;
                    local_260._16_4_ = fVar198;
                    local_260._0_16_ = auVar110;
                    local_260._20_4_ = fVar198;
                    local_260._24_4_ = fVar198;
                    local_260._28_4_ = fVar198;
                    local_240 = *(undefined4 *)((long)&local_300 + local_960._0_8_ * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_2e0 + local_960._0_8_ * 4);
                    fVar205 = 1.0 - fVar198;
                    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                              ZEXT416(0xc0a00000));
                    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * fVar198 * 3.0)),
                                             ZEXT416((uint)(fVar198 + fVar198)),auVar20);
                    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                              ZEXT416(0x40000000));
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * fVar205 * -3.0)),
                                              ZEXT416((uint)(fVar205 + fVar205)),auVar20);
                    auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar198 * (fVar205 + fVar205))),
                                              ZEXT416((uint)fVar205),ZEXT416((uint)fVar205));
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * fVar198)),auVar110,
                                             ZEXT416((uint)(fVar205 * -2.0)));
                    fVar198 = auVar20._0_4_ * 0.5;
                    fVar205 = auVar8._0_4_ * 0.5;
                    auVar162._0_4_ = fVar205 * (float)local_680._0_4_;
                    auVar162._4_4_ = fVar205 * (float)local_680._4_4_;
                    auVar162._8_4_ = fVar205 * fStack_678;
                    auVar162._12_4_ = fVar205 * fStack_674;
                    auVar142._4_4_ = fVar198;
                    auVar142._0_4_ = fVar198;
                    auVar142._8_4_ = fVar198;
                    auVar142._12_4_ = fVar198;
                    auVar20 = vfmadd132ps_fma(auVar142,auVar162,auVar12);
                    fVar198 = auVar7._0_4_ * 0.5;
                    auVar163._4_4_ = fVar198;
                    auVar163._0_4_ = fVar198;
                    auVar163._8_4_ = fVar198;
                    auVar163._12_4_ = fVar198;
                    auVar20 = vfmadd132ps_fma(auVar163,auVar20,auVar11);
                    local_790.context = context->user;
                    fVar198 = auVar9._0_4_ * 0.5;
                    auVar143._4_4_ = fVar198;
                    auVar143._0_4_ = fVar198;
                    auVar143._8_4_ = fVar198;
                    auVar143._12_4_ = fVar198;
                    auVar7 = vfmadd132ps_fma(auVar143,auVar20,auVar10);
                    local_2c0 = auVar7._0_4_;
                    uStack_2bc = local_2c0;
                    uStack_2b8 = local_2c0;
                    uStack_2b4 = local_2c0;
                    uStack_2b0 = local_2c0;
                    uStack_2ac = local_2c0;
                    uStack_2a8 = local_2c0;
                    uStack_2a4 = local_2c0;
                    auVar20 = vmovshdup_avx(auVar7);
                    local_2a0 = auVar20._0_8_;
                    uStack_298 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_288 = local_2a0;
                    auVar20 = vshufps_avx(auVar7,auVar7,0xaa);
                    local_280._8_8_ = auVar20._0_8_;
                    local_280._0_8_ = local_280._8_8_;
                    local_280._16_8_ = local_280._8_8_;
                    local_280._24_8_ = local_280._8_8_;
                    uStack_23c = local_240;
                    uStack_238 = local_240;
                    uStack_234 = local_240;
                    uStack_230 = local_240;
                    uStack_22c = local_240;
                    uStack_228 = local_240;
                    uStack_224 = local_240;
                    local_220 = CONCAT44(uStack_17c,local_180);
                    uStack_218 = CONCAT44(uStack_174,uStack_178);
                    uStack_210 = CONCAT44(uStack_16c,uStack_170);
                    uStack_208 = CONCAT44(uStack_164,uStack_168);
                    local_200._4_4_ = uStack_15c;
                    local_200._0_4_ = local_160;
                    local_200._8_4_ = uStack_158;
                    local_200._12_4_ = uStack_154;
                    local_200._16_4_ = uStack_150;
                    local_200._20_4_ = uStack_14c;
                    local_200._24_4_ = uStack_148;
                    local_200._28_4_ = uStack_144;
                    vpcmpeqd_avx2(local_200,local_200);
                    local_1e0 = (local_790.context)->instID[0];
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = (local_790.context)->instPrimID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_6a0 = local_440;
                    local_790.valid = (int *)local_6a0;
                    local_790.geometryUserPtr = pGVar15->userPtr;
                    local_790.hit = (RTCHitN *)&local_2c0;
                    local_790.N = 8;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar203 = ZEXT1664(auVar203._0_16_);
                      (*pGVar15->occlusionFilterN)(&local_790);
                    }
                    auVar122 = vpcmpeqd_avx2(local_6a0,_DAT_01faff00);
                    auVar125 = _DAT_01fe9960 & ~auVar122;
                    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar125 >> 0x7f,0) == '\0') &&
                          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar125 >> 0xbf,0) == '\0') &&
                        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar125[0x1f]) {
                      auVar122 = auVar122 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar203 = ZEXT1664(auVar203._0_16_);
                        (*p_Var18)(&local_790);
                      }
                      auVar125 = vpcmpeqd_avx2(local_6a0,_DAT_01faff00);
                      auVar122 = auVar125 ^ _DAT_01fe9960;
                      auVar151._8_4_ = 0xff800000;
                      auVar151._0_8_ = 0xff800000ff800000;
                      auVar151._12_4_ = 0xff800000;
                      auVar151._16_4_ = 0xff800000;
                      auVar151._20_4_ = 0xff800000;
                      auVar151._24_4_ = 0xff800000;
                      auVar151._28_4_ = 0xff800000;
                      auVar125 = vblendvps_avx(auVar151,*(undefined1 (*) [32])
                                                         (local_790.ray + 0x100),auVar125);
                      *(undefined1 (*) [32])(local_790.ray + 0x100) = auVar125;
                    }
                    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar122 >> 0x7f,0) != '\0') ||
                          (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar122 >> 0xbf,0) != '\0') ||
                        (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar122[0x1f] < '\0') {
                      bVar95 = 1;
                      goto LAB_0190ce3b;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                    bVar95 = 0;
                    lVar17 = 0;
                    local_940 = local_940 ^ 1L << (local_960._0_8_ & 0x3f);
                    for (uVar98 = local_940; (uVar98 & 1) == 0;
                        uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                      lVar17 = lVar17 + 1;
                    }
                    local_960._0_8_ = lVar17;
                    auVar190 = ZEXT3264(local_760);
                    auVar216 = ZEXT3264(auVar118);
                    auVar174 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar135,CONCAT420(fVar152,
                                                  CONCAT416(fVar135,CONCAT412(fVar152,CONCAT48(
                                                  fVar135,uVar106)))))));
                    auVar177 = ZEXT3264(CONCAT428(fVar213,CONCAT424(fVar213,CONCAT420(fVar213,
                                                  CONCAT416(fVar213,CONCAT412(fVar213,CONCAT48(
                                                  fVar213,CONCAT44(fVar213,fVar213))))))));
                  } while (local_940 != 0);
                }
              }
              bVar102 = (bool)(bVar102 | bVar95);
            }
          }
          local_760 = auVar190._0_32_;
          local_920 = auVar216._0_32_;
          lVar104 = lVar104 + 8;
          auVar158 = ZEXT3264(local_740);
        } while ((int)lVar104 < iVar97);
      }
      if (bVar102) {
        return bVar102;
      }
      uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar119._4_4_ = uVar105;
      auVar119._0_4_ = uVar105;
      auVar119._8_4_ = uVar105;
      auVar119._12_4_ = uVar105;
      auVar119._16_4_ = uVar105;
      auVar119._20_4_ = uVar105;
      auVar119._24_4_ = uVar105;
      auVar119._28_4_ = uVar105;
      auVar125 = vcmpps_avx(local_80,auVar119,2);
      uVar99 = vmovmskps_avx(auVar125);
      uVar96 = uVar96 & uVar96 + 0xff & uVar99;
    } while (uVar96 != 0);
  }
  return bVar102;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }